

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [60];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  byte bVar44;
  uint uVar45;
  ulong uVar46;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  undefined8 in_R11;
  ulong uVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar77 [16];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  float fVar120;
  vint4 bi_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  float fVar127;
  undefined4 uVar128;
  float fVar133;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar129 [16];
  float fVar135;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 bi;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  vint4 ai;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  vint4 ai_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  vfloat4 a0_3;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  __m128 a_1;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  __m128 a;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar226;
  float fVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar229;
  float fVar240;
  float fVar241;
  vfloat4 a0_1;
  undefined1 auVar230 [16];
  float fVar242;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar248;
  float fVar249;
  vfloat4 a0;
  undefined1 auVar244 [16];
  float fVar250;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint local_628;
  RTCFilterFunctionNArguments local_620;
  uint auStack_5f0 [4];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar47;
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  float fVar152;
  float fVar157;
  float fVar158;
  float fVar168;
  
  uVar46 = (ulong)(byte)prim[1];
  fVar120 = *(float *)(prim + uVar46 * 0x19 + 0x12);
  auVar56 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar56 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar57 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar57 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar56 = vsubps_avx(auVar56,*(undefined1 (*) [16])(prim + uVar46 * 0x19 + 6));
  auVar75._0_4_ = fVar120 * auVar56._0_4_;
  auVar75._4_4_ = fVar120 * auVar56._4_4_;
  auVar75._8_4_ = fVar120 * auVar56._8_4_;
  auVar75._12_4_ = fVar120 * auVar56._12_4_;
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 4 + 6)));
  auVar65._0_4_ = fVar120 * auVar57._0_4_;
  auVar65._4_4_ = fVar120 * auVar57._4_4_;
  auVar65._8_4_ = fVar120 * auVar57._8_4_;
  auVar65._12_4_ = fVar120 * auVar57._12_4_;
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 5 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 6 + 6)));
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0xb + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0xc + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0xd + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0x13 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 * 0x14 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar81._4_4_ = auVar65._0_4_;
  auVar81._0_4_ = auVar65._0_4_;
  auVar81._8_4_ = auVar65._0_4_;
  auVar81._12_4_ = auVar65._0_4_;
  auVar59 = vshufps_avx(auVar65,auVar65,0x55);
  auVar61 = vshufps_avx(auVar65,auVar65,0xaa);
  fVar120 = auVar61._0_4_;
  auVar77._0_4_ = fVar120 * auVar58._0_4_;
  fVar228 = auVar61._4_4_;
  auVar77._4_4_ = fVar228 * auVar58._4_4_;
  fVar217 = auVar61._8_4_;
  auVar77._8_4_ = fVar217 * auVar58._8_4_;
  fVar226 = auVar61._12_4_;
  auVar77._12_4_ = fVar226 * auVar58._12_4_;
  auVar72._0_4_ = auVar64._0_4_ * fVar120;
  auVar72._4_4_ = auVar64._4_4_ * fVar228;
  auVar72._8_4_ = auVar64._8_4_ * fVar217;
  auVar72._12_4_ = auVar64._12_4_ * fVar226;
  auVar66._0_4_ = fVar120 * auVar60._0_4_;
  auVar66._4_4_ = fVar228 * auVar60._4_4_;
  auVar66._8_4_ = fVar217 * auVar60._8_4_;
  auVar66._12_4_ = fVar226 * auVar60._12_4_;
  auVar61 = vfmadd231ps_fma(auVar77,auVar59,auVar57);
  auVar62 = vfmadd231ps_fma(auVar72,auVar59,auVar68);
  auVar59 = vfmadd231ps_fma(auVar66,auVar70,auVar59);
  auVar63 = vfmadd231ps_fma(auVar61,auVar81,auVar56);
  auVar62 = vfmadd231ps_fma(auVar62,auVar81,auVar67);
  auVar65 = vfmadd231ps_fma(auVar59,auVar69,auVar81);
  auVar83._4_4_ = auVar75._0_4_;
  auVar83._0_4_ = auVar75._0_4_;
  auVar83._8_4_ = auVar75._0_4_;
  auVar83._12_4_ = auVar75._0_4_;
  auVar59 = vshufps_avx(auVar75,auVar75,0x55);
  auVar61 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar120 = auVar61._0_4_;
  auVar180._0_4_ = fVar120 * auVar58._0_4_;
  fVar228 = auVar61._4_4_;
  auVar180._4_4_ = fVar228 * auVar58._4_4_;
  fVar217 = auVar61._8_4_;
  auVar180._8_4_ = fVar217 * auVar58._8_4_;
  fVar226 = auVar61._12_4_;
  auVar180._12_4_ = fVar226 * auVar58._12_4_;
  auVar76._0_4_ = fVar120 * auVar64._0_4_;
  auVar76._4_4_ = fVar228 * auVar64._4_4_;
  auVar76._8_4_ = fVar217 * auVar64._8_4_;
  auVar76._12_4_ = fVar226 * auVar64._12_4_;
  auVar82._0_4_ = fVar120 * auVar60._0_4_;
  auVar82._4_4_ = fVar228 * auVar60._4_4_;
  auVar82._8_4_ = fVar217 * auVar60._8_4_;
  auVar82._12_4_ = fVar226 * auVar60._12_4_;
  auVar57 = vfmadd231ps_fma(auVar180,auVar59,auVar57);
  auVar58 = vfmadd231ps_fma(auVar76,auVar59,auVar68);
  auVar68 = vfmadd231ps_fma(auVar82,auVar59,auVar70);
  auVar64 = vfmadd231ps_fma(auVar57,auVar83,auVar56);
  auVar70 = vfmadd231ps_fma(auVar58,auVar83,auVar67);
  auVar60 = vfmadd231ps_fma(auVar68,auVar83,auVar69);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar263 = ZEXT1664(auVar56);
  auVar57 = vandps_avx512vl(auVar63,auVar56);
  auVar73._8_4_ = 0x219392ef;
  auVar73._0_8_ = 0x219392ef219392ef;
  auVar73._12_4_ = 0x219392ef;
  uVar51 = vcmpps_avx512vl(auVar57,auVar73,1);
  bVar54 = (bool)((byte)uVar51 & 1);
  auVar61._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._0_4_;
  bVar54 = (bool)((byte)(uVar51 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._4_4_;
  bVar54 = (bool)((byte)(uVar51 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._8_4_;
  bVar54 = (bool)((byte)(uVar51 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._12_4_;
  auVar57 = vandps_avx512vl(auVar62,auVar56);
  uVar51 = vcmpps_avx512vl(auVar57,auVar73,1);
  bVar54 = (bool)((byte)uVar51 & 1);
  auVar63._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar62._0_4_;
  bVar54 = (bool)((byte)(uVar51 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar62._4_4_;
  bVar54 = (bool)((byte)(uVar51 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar62._8_4_;
  bVar54 = (bool)((byte)(uVar51 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar62._12_4_;
  auVar56 = vandps_avx512vl(auVar65,auVar56);
  uVar51 = vcmpps_avx512vl(auVar56,auVar73,1);
  bVar54 = (bool)((byte)uVar51 & 1);
  auVar62._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._0_4_;
  bVar54 = (bool)((byte)(uVar51 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._4_4_;
  bVar54 = (bool)((byte)(uVar51 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._8_4_;
  bVar54 = (bool)((byte)(uVar51 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar65._12_4_;
  auVar56 = vrcp14ps_avx512vl(auVar61);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar264 = ZEXT1664(auVar57);
  auVar58 = vfnmadd213ps_avx512vl(auVar61,auVar56,auVar57);
  auVar67 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar63);
  auVar58 = vfnmadd213ps_avx512vl(auVar63,auVar56,auVar57);
  auVar68 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
  auVar58 = vrcp14ps_avx512vl(auVar62);
  auVar57 = vfnmadd213ps_avx512vl(auVar62,auVar58,auVar57);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar46 * 7 + 6);
  auVar56 = vpmovsxwd_avx(auVar56);
  auVar69 = vfmadd132ps_fma(auVar57,auVar58,auVar58);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar58 = vsubps_avx(auVar56,auVar64);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar46 * 9 + 6);
  auVar56 = vpmovsxwd_avx(auVar57);
  auVar159._0_4_ = auVar67._0_4_ * auVar58._0_4_;
  auVar159._4_4_ = auVar67._4_4_ * auVar58._4_4_;
  auVar159._8_4_ = auVar67._8_4_ * auVar58._8_4_;
  auVar159._12_4_ = auVar67._12_4_ * auVar58._12_4_;
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar57 = vsubps_avx(auVar56,auVar64);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar46 * 0xe + 6);
  auVar56 = vpmovsxwd_avx(auVar58);
  auVar78._0_4_ = auVar67._0_4_ * auVar57._0_4_;
  auVar78._4_4_ = auVar67._4_4_ * auVar57._4_4_;
  auVar78._8_4_ = auVar67._8_4_ * auVar57._8_4_;
  auVar78._12_4_ = auVar67._12_4_ * auVar57._12_4_;
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar70);
  auVar74._0_4_ = auVar68._0_4_ * auVar56._0_4_;
  auVar74._4_4_ = auVar68._4_4_ * auVar56._4_4_;
  auVar74._8_4_ = auVar68._8_4_ * auVar56._8_4_;
  auVar74._12_4_ = auVar68._12_4_ * auVar56._12_4_;
  auVar58 = vpbroadcastd_avx512vl();
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar56 = vpmovsxwd_avx(auVar67);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar70);
  auVar80._0_4_ = auVar68._0_4_ * auVar56._0_4_;
  auVar80._4_4_ = auVar68._4_4_ * auVar56._4_4_;
  auVar80._8_4_ = auVar68._8_4_ * auVar56._8_4_;
  auVar80._12_4_ = auVar68._12_4_ * auVar56._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar46 * 0x15 + 6);
  auVar56 = vpmovsxwd_avx(auVar68);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar60);
  auVar79._0_4_ = auVar69._0_4_ * auVar56._0_4_;
  auVar79._4_4_ = auVar69._4_4_ * auVar56._4_4_;
  auVar79._8_4_ = auVar69._8_4_ * auVar56._8_4_;
  auVar79._12_4_ = auVar69._12_4_ * auVar56._12_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar46 * 0x17 + 6);
  auVar56 = vpmovsxwd_avx(auVar64);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar60);
  auVar71._0_4_ = auVar69._0_4_ * auVar56._0_4_;
  auVar71._4_4_ = auVar69._4_4_ * auVar56._4_4_;
  auVar71._8_4_ = auVar69._8_4_ * auVar56._8_4_;
  auVar71._12_4_ = auVar69._12_4_ * auVar56._12_4_;
  auVar56 = vpminsd_avx(auVar159,auVar78);
  auVar57 = vpminsd_avx(auVar74,auVar80);
  auVar56 = vmaxps_avx(auVar56,auVar57);
  auVar57 = vpminsd_avx(auVar79,auVar71);
  uVar128 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar69._4_4_ = uVar128;
  auVar69._0_4_ = uVar128;
  auVar69._8_4_ = uVar128;
  auVar69._12_4_ = uVar128;
  auVar57 = vmaxps_avx512vl(auVar57,auVar69);
  auVar56 = vmaxps_avx(auVar56,auVar57);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar56,auVar70);
  auVar56 = vpmaxsd_avx(auVar159,auVar78);
  auVar57 = vpmaxsd_avx(auVar74,auVar80);
  auVar56 = vminps_avx(auVar56,auVar57);
  auVar57 = vpmaxsd_avx(auVar79,auVar71);
  uVar128 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar60._4_4_ = uVar128;
  auVar60._0_4_ = uVar128;
  auVar60._8_4_ = uVar128;
  auVar60._12_4_ = uVar128;
  auVar57 = vminps_avx512vl(auVar57,auVar60);
  auVar56 = vminps_avx(auVar56,auVar57);
  auVar59._8_4_ = 0x3f800003;
  auVar59._0_8_ = 0x3f8000033f800003;
  auVar59._12_4_ = 0x3f800003;
  auVar56 = vmulps_avx512vl(auVar56,auVar59);
  uVar22 = vcmpps_avx512vl(local_5e0,auVar56,2);
  uVar23 = vpcmpgtd_avx512vl(auVar58,_DAT_01f4ad30);
  uVar51 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)((byte)uVar22 & 0xf & (byte)uVar23));
  auVar126 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar126);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar126 = ZEXT1664(auVar56);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar259 = ZEXT1664(auVar56);
  auVar266 = ZEXT464(0x3f800000);
LAB_017e351c:
  if (uVar51 == 0) {
    return;
  }
  lVar48 = 0;
  for (uVar46 = uVar51; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
    lVar48 = lVar48 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar48 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar4].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar46 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar5 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar56 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar46);
  lVar48 = uVar46 + 1;
  auVar57 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar48);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar58 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar46);
  auVar67 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar48);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar120 = *(float *)(ray + k * 4 + 0xc0);
  auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar60 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar46),
                       auVar56,auVar59);
  auVar61 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar48),
                       auVar57,auVar59);
  auVar62 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar46 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar58,auVar59);
  auVar63 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar48),
                       auVar67,auVar59);
  auVar71 = ZEXT816(0) << 0x40;
  auVar129._0_4_ = auVar57._0_4_ * 0.0;
  auVar129._4_4_ = auVar57._4_4_ * 0.0;
  auVar129._8_4_ = auVar57._8_4_ * 0.0;
  auVar129._12_4_ = auVar57._12_4_ * 0.0;
  auVar69 = vfmadd231ps_fma(auVar129,auVar61,auVar71);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar60,auVar69);
  auVar136._0_4_ = auVar56._0_4_ + auVar64._0_4_;
  auVar136._4_4_ = auVar56._4_4_ + auVar64._4_4_;
  auVar136._8_4_ = auVar56._8_4_ + auVar64._8_4_;
  auVar136._12_4_ = auVar56._12_4_ + auVar64._12_4_;
  auVar72 = auVar126._0_16_;
  auVar64 = vfmadd231ps_avx512vl(auVar69,auVar60,auVar72);
  auVar65 = vfnmadd231ps_avx512vl(auVar64,auVar56,auVar72);
  auVar230._0_4_ = auVar67._0_4_ * 0.0;
  auVar230._4_4_ = auVar67._4_4_ * 0.0;
  auVar230._8_4_ = auVar67._8_4_ * 0.0;
  auVar230._12_4_ = auVar67._12_4_ * 0.0;
  auVar69 = vfmadd231ps_fma(auVar230,auVar63,auVar71);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar62,auVar69);
  auVar244._0_4_ = auVar58._0_4_ + auVar64._0_4_;
  auVar244._4_4_ = auVar58._4_4_ + auVar64._4_4_;
  auVar244._8_4_ = auVar58._8_4_ + auVar64._8_4_;
  auVar244._12_4_ = auVar58._12_4_ + auVar64._12_4_;
  auVar64 = vfmadd231ps_avx512vl(auVar69,auVar62,auVar72);
  auVar66 = vfnmadd231ps_avx512vl(auVar64,auVar58,auVar72);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar57);
  auVar64 = vfmadd231ps_fma(auVar64,auVar60,auVar71);
  auVar70 = vfmadd231ps_fma(auVar64,auVar56,auVar71);
  auVar57 = vmulps_avx512vl(auVar57,auVar72);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar72,auVar61);
  auVar57 = vfmadd231ps_fma(auVar57,auVar71,auVar60);
  auVar60 = vfnmadd231ps_fma(auVar57,auVar71,auVar56);
  auVar56 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar63,auVar67);
  auVar56 = vfmadd231ps_fma(auVar56,auVar62,auVar71);
  auVar64 = vfmadd231ps_fma(auVar56,auVar58,auVar71);
  auVar56 = vmulps_avx512vl(auVar67,auVar72);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar72,auVar63);
  auVar56 = vfmadd231ps_fma(auVar56,auVar71,auVar62);
  auVar69 = vfnmadd231ps_fma(auVar56,auVar71,auVar58);
  auVar56 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar57 = vshufps_avx(auVar244,auVar244,0xc9);
  fVar127 = auVar65._0_4_;
  auVar181._0_4_ = fVar127 * auVar57._0_4_;
  fVar133 = auVar65._4_4_;
  auVar181._4_4_ = fVar133 * auVar57._4_4_;
  fVar134 = auVar65._8_4_;
  auVar181._8_4_ = fVar134 * auVar57._8_4_;
  fVar135 = auVar65._12_4_;
  auVar181._12_4_ = fVar135 * auVar57._12_4_;
  auVar57 = vfmsub231ps_fma(auVar181,auVar56,auVar244);
  auVar58 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar57 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar200._0_4_ = auVar57._0_4_ * fVar127;
  auVar200._4_4_ = auVar57._4_4_ * fVar133;
  auVar200._8_4_ = auVar57._8_4_ * fVar134;
  auVar200._12_4_ = auVar57._12_4_ * fVar135;
  auVar56 = vfmsub231ps_fma(auVar200,auVar56,auVar66);
  auVar67 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar57 = vshufps_avx(auVar64,auVar64,0xc9);
  fVar228 = auVar60._0_4_;
  auVar210._0_4_ = auVar57._0_4_ * fVar228;
  fVar217 = auVar60._4_4_;
  auVar210._4_4_ = auVar57._4_4_ * fVar217;
  fVar226 = auVar60._8_4_;
  auVar210._8_4_ = auVar57._8_4_ * fVar226;
  fVar227 = auVar60._12_4_;
  auVar210._12_4_ = auVar57._12_4_ * fVar227;
  auVar57 = vfmsub231ps_fma(auVar210,auVar56,auVar64);
  auVar64 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar57 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar211._0_4_ = auVar57._0_4_ * fVar228;
  auVar211._4_4_ = auVar57._4_4_ * fVar217;
  auVar211._8_4_ = auVar57._8_4_ * fVar226;
  auVar211._12_4_ = auVar57._12_4_ * fVar227;
  auVar56 = vfmsub231ps_fma(auVar211,auVar56,auVar69);
  auVar69 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vdpps_avx(auVar58,auVar58,0x7f);
  fVar152 = auVar56._0_4_;
  auVar212._4_12_ = ZEXT812(0) << 0x20;
  auVar212._0_4_ = fVar152;
  auVar57 = vrsqrt14ss_avx512f(auVar71,auVar212);
  auVar61 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
  auVar62 = vmulss_avx512f(auVar56,ZEXT416(0x3f000000));
  fVar157 = auVar57._0_4_;
  fVar158 = auVar61._0_4_ - auVar62._0_4_ * fVar157 * fVar157 * fVar157;
  auVar57 = vdpps_avx(auVar58,auVar67,0x7f);
  fVar243 = fVar158 * auVar58._0_4_;
  fVar248 = fVar158 * auVar58._4_4_;
  fVar249 = fVar158 * auVar58._8_4_;
  fVar250 = fVar158 * auVar58._12_4_;
  auVar201._0_4_ = fVar152 * auVar67._0_4_;
  auVar201._4_4_ = fVar152 * auVar67._4_4_;
  auVar201._8_4_ = fVar152 * auVar67._8_4_;
  auVar201._12_4_ = fVar152 * auVar67._12_4_;
  fVar152 = auVar57._0_4_;
  auVar182._0_4_ = fVar152 * auVar58._0_4_;
  auVar182._4_4_ = fVar152 * auVar58._4_4_;
  auVar182._8_4_ = fVar152 * auVar58._8_4_;
  auVar182._12_4_ = fVar152 * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar201,auVar182);
  auVar57 = vrcp14ss_avx512f(auVar71,auVar212);
  auVar56 = vfnmadd213ss_avx512f(auVar56,auVar57,ZEXT416(0x40000000));
  fVar152 = auVar57._0_4_ * auVar56._0_4_;
  auVar56 = vdpps_avx(auVar64,auVar64,0x7f);
  fVar157 = auVar56._0_4_;
  auVar202._4_12_ = ZEXT812(0) << 0x20;
  auVar202._0_4_ = fVar157;
  auVar57 = vrsqrt14ss_avx512f(auVar71,auVar202);
  auVar67 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
  auVar61 = vmulss_avx512f(auVar56,ZEXT416(0x3f000000));
  fVar168 = auVar57._0_4_;
  fVar168 = auVar67._0_4_ - auVar61._0_4_ * fVar168 * fVar168 * fVar168;
  auVar57 = vdpps_avx(auVar64,auVar69,0x7f);
  fVar229 = fVar168 * auVar64._0_4_;
  fVar240 = fVar168 * auVar64._4_4_;
  fVar241 = fVar168 * auVar64._8_4_;
  fVar242 = fVar168 * auVar64._12_4_;
  auVar169._0_4_ = fVar157 * auVar69._0_4_;
  auVar169._4_4_ = fVar157 * auVar69._4_4_;
  auVar169._8_4_ = fVar157 * auVar69._8_4_;
  auVar169._12_4_ = fVar157 * auVar69._12_4_;
  fVar157 = auVar57._0_4_;
  auVar160._0_4_ = fVar157 * auVar64._0_4_;
  auVar160._4_4_ = fVar157 * auVar64._4_4_;
  auVar160._8_4_ = fVar157 * auVar64._8_4_;
  auVar160._12_4_ = fVar157 * auVar64._12_4_;
  auVar67 = vsubps_avx(auVar169,auVar160);
  auVar57 = vrcp14ss_avx512f(auVar71,auVar202);
  auVar56 = vfnmadd213ss_avx512f(auVar56,auVar57,ZEXT416(0x40000000));
  fVar157 = auVar56._0_4_ * auVar57._0_4_;
  auVar56 = vshufps_avx(auVar136,auVar136,0xff);
  auVar188._0_4_ = fVar243 * auVar56._0_4_;
  auVar188._4_4_ = fVar248 * auVar56._4_4_;
  auVar188._8_4_ = fVar249 * auVar56._8_4_;
  auVar188._12_4_ = fVar250 * auVar56._12_4_;
  local_520 = vsubps_avx(auVar136,auVar188);
  auVar57 = vshufps_avx(auVar65,auVar65,0xff);
  auVar170._0_4_ = auVar57._0_4_ * fVar243 + auVar56._0_4_ * fVar158 * fVar152 * auVar58._0_4_;
  auVar170._4_4_ = auVar57._4_4_ * fVar248 + auVar56._4_4_ * fVar158 * fVar152 * auVar58._4_4_;
  auVar170._8_4_ = auVar57._8_4_ * fVar249 + auVar56._8_4_ * fVar158 * fVar152 * auVar58._8_4_;
  auVar170._12_4_ = auVar57._12_4_ * fVar250 + auVar56._12_4_ * fVar158 * fVar152 * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar65,auVar170);
  local_530._0_4_ = auVar188._0_4_ + auVar136._0_4_;
  local_530._4_4_ = auVar188._4_4_ + auVar136._4_4_;
  fStack_528 = auVar188._8_4_ + auVar136._8_4_;
  fStack_524 = auVar188._12_4_ + auVar136._12_4_;
  auVar130._0_4_ = fVar127 + auVar170._0_4_;
  auVar130._4_4_ = fVar133 + auVar170._4_4_;
  auVar130._8_4_ = fVar134 + auVar170._8_4_;
  auVar130._12_4_ = fVar135 + auVar170._12_4_;
  auVar56 = vshufps_avx(auVar70,auVar70,0xff);
  auVar171._0_4_ = fVar229 * auVar56._0_4_;
  auVar171._4_4_ = fVar240 * auVar56._4_4_;
  auVar171._8_4_ = fVar241 * auVar56._8_4_;
  auVar171._12_4_ = fVar242 * auVar56._12_4_;
  local_540 = vsubps_avx(auVar70,auVar171);
  auVar57 = vshufps_avx(auVar60,auVar60,0xff);
  auVar137._0_4_ = auVar57._0_4_ * fVar229 + auVar56._0_4_ * fVar168 * auVar67._0_4_ * fVar157;
  auVar137._4_4_ = auVar57._4_4_ * fVar240 + auVar56._4_4_ * fVar168 * auVar67._4_4_ * fVar157;
  auVar137._8_4_ = auVar57._8_4_ * fVar241 + auVar56._8_4_ * fVar168 * auVar67._8_4_ * fVar157;
  auVar137._12_4_ = auVar57._12_4_ * fVar242 + auVar56._12_4_ * fVar168 * auVar67._12_4_ * fVar157;
  auVar56 = vsubps_avx(auVar60,auVar137);
  _local_550 = vaddps_avx512vl(auVar70,auVar171);
  auVar138._0_4_ = fVar228 + auVar137._0_4_;
  auVar138._4_4_ = fVar217 + auVar137._4_4_;
  auVar138._8_4_ = fVar226 + auVar137._8_4_;
  auVar138._12_4_ = fVar227 + auVar137._12_4_;
  auVar57 = vmulps_avx512vl(auVar58,auVar59);
  local_560 = vaddps_avx512vl(local_520,auVar57);
  auVar56 = vmulps_avx512vl(auVar56,auVar59);
  local_570 = vsubps_avx512vl(local_540,auVar56);
  auVar56 = vmulps_avx512vl(auVar130,auVar59);
  _local_580 = vaddps_avx512vl(_local_530,auVar56);
  auVar56 = vmulps_avx512vl(auVar138,auVar59);
  _local_590 = vsubps_avx512vl(_local_550,auVar56);
  local_4a0 = vsubps_avx(local_520,auVar68);
  uVar128 = local_4a0._0_4_;
  auVar139._4_4_ = uVar128;
  auVar139._0_4_ = uVar128;
  auVar139._8_4_ = uVar128;
  auVar139._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar57 = vshufps_avx(local_4a0,local_4a0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar228 = pre->ray_space[k].vz.field_0.m128[0];
  fVar217 = pre->ray_space[k].vz.field_0.m128[1];
  fVar226 = pre->ray_space[k].vz.field_0.m128[2];
  fVar227 = pre->ray_space[k].vz.field_0.m128[3];
  auVar131._0_4_ = fVar228 * auVar57._0_4_;
  auVar131._4_4_ = fVar217 * auVar57._4_4_;
  auVar131._8_4_ = fVar226 * auVar57._8_4_;
  auVar131._12_4_ = fVar227 * auVar57._12_4_;
  auVar56 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar3,auVar56);
  auVar69 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar139);
  local_4b0 = vsubps_avx512vl(local_560,auVar68);
  uVar128 = local_4b0._0_4_;
  auVar145._4_4_ = uVar128;
  auVar145._0_4_ = uVar128;
  auVar145._8_4_ = uVar128;
  auVar145._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar57 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar140._0_4_ = fVar228 * auVar57._0_4_;
  auVar140._4_4_ = fVar217 * auVar57._4_4_;
  auVar140._8_4_ = fVar226 * auVar57._8_4_;
  auVar140._12_4_ = fVar227 * auVar57._12_4_;
  auVar56 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar3,auVar56);
  auVar70 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar145);
  local_4c0 = vsubps_avx512vl(local_570,auVar68);
  uVar128 = local_4c0._0_4_;
  auVar172._4_4_ = uVar128;
  auVar172._0_4_ = uVar128;
  auVar172._8_4_ = uVar128;
  auVar172._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar57 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar146._0_4_ = fVar228 * auVar57._0_4_;
  auVar146._4_4_ = fVar217 * auVar57._4_4_;
  auVar146._8_4_ = fVar226 * auVar57._8_4_;
  auVar146._12_4_ = fVar227 * auVar57._12_4_;
  auVar56 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar3,auVar56);
  auVar60 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar172);
  local_4d0 = vsubps_avx(local_540,auVar68);
  uVar128 = local_4d0._0_4_;
  auVar189._4_4_ = uVar128;
  auVar189._0_4_ = uVar128;
  auVar189._8_4_ = uVar128;
  auVar189._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar57 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar173._0_4_ = fVar228 * auVar57._0_4_;
  auVar173._4_4_ = fVar217 * auVar57._4_4_;
  auVar173._8_4_ = fVar226 * auVar57._8_4_;
  auVar173._12_4_ = fVar227 * auVar57._12_4_;
  auVar56 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar3,auVar56);
  auVar59 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar189);
  local_4e0 = vsubps_avx(_local_530,auVar68);
  uVar128 = local_4e0._0_4_;
  auVar190._4_4_ = uVar128;
  auVar190._0_4_ = uVar128;
  auVar190._8_4_ = uVar128;
  auVar190._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar57 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar213._0_4_ = auVar57._0_4_ * fVar228;
  auVar213._4_4_ = auVar57._4_4_ * fVar217;
  auVar213._8_4_ = auVar57._8_4_ * fVar226;
  auVar213._12_4_ = auVar57._12_4_ * fVar227;
  auVar56 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar3,auVar56);
  auVar61 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar190);
  local_4f0 = vsubps_avx512vl(_local_580,auVar68);
  uVar128 = local_4f0._0_4_;
  auVar191._4_4_ = uVar128;
  auVar191._0_4_ = uVar128;
  auVar191._8_4_ = uVar128;
  auVar191._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar57 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar218._0_4_ = auVar57._0_4_ * fVar228;
  auVar218._4_4_ = auVar57._4_4_ * fVar217;
  auVar218._8_4_ = auVar57._8_4_ * fVar226;
  auVar218._12_4_ = auVar57._12_4_ * fVar227;
  auVar56 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar3,auVar56);
  auVar62 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar191);
  local_500 = vsubps_avx512vl(_local_590,auVar68);
  uVar128 = local_500._0_4_;
  auVar192._4_4_ = uVar128;
  auVar192._0_4_ = uVar128;
  auVar192._8_4_ = uVar128;
  auVar192._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_500,local_500,0x55);
  auVar57 = vshufps_avx(local_500,local_500,0xaa);
  auVar231._0_4_ = auVar57._0_4_ * fVar228;
  auVar231._4_4_ = auVar57._4_4_ * fVar217;
  auVar231._8_4_ = auVar57._8_4_ * fVar226;
  auVar231._12_4_ = auVar57._12_4_ * fVar227;
  auVar56 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar3,auVar56);
  auVar63 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar192);
  local_510 = vsubps_avx512vl(_local_550,auVar68);
  uVar128 = local_510._0_4_;
  auVar121._4_4_ = uVar128;
  auVar121._0_4_ = uVar128;
  auVar121._8_4_ = uVar128;
  auVar121._12_4_ = uVar128;
  auVar56 = vshufps_avx(local_510,local_510,0x55);
  auVar57 = vshufps_avx(local_510,local_510,0xaa);
  auVar183._0_4_ = auVar57._0_4_ * fVar228;
  auVar183._4_4_ = auVar57._4_4_ * fVar217;
  auVar183._8_4_ = auVar57._8_4_ * fVar226;
  auVar183._12_4_ = auVar57._12_4_ * fVar227;
  auVar56 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar3,auVar56);
  auVar65 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar121);
  auVar58 = vmovlhps_avx(auVar69,auVar61);
  auVar67 = vmovlhps_avx(auVar70,auVar62);
  auVar64 = vmovlhps_avx512f(auVar60,auVar63);
  _local_480 = vmovlhps_avx512f(auVar59,auVar65);
  auVar57 = vminps_avx(auVar58,auVar67);
  auVar56 = vmaxps_avx(auVar58,auVar67);
  auVar68 = vminps_avx512vl(auVar64,_local_480);
  auVar57 = vminps_avx(auVar57,auVar68);
  auVar68 = vmaxps_avx512vl(auVar64,_local_480);
  auVar56 = vmaxps_avx(auVar56,auVar68);
  auVar68 = vshufpd_avx(auVar57,auVar57,3);
  auVar57 = vminps_avx(auVar57,auVar68);
  auVar68 = vshufpd_avx(auVar56,auVar56,3);
  auVar56 = vmaxps_avx(auVar56,auVar68);
  auVar57 = vandps_avx512vl(auVar57,auVar263._0_16_);
  auVar56 = vandps_avx512vl(auVar56,auVar263._0_16_);
  auVar56 = vmaxps_avx(auVar57,auVar56);
  auVar57 = vmovshdup_avx(auVar56);
  auVar56 = vmaxss_avx(auVar57,auVar56);
  local_628 = (uint)uVar51 + 0xf;
  auVar57 = vmovddup_avx512vl(auVar69);
  auVar68 = vmovddup_avx512vl(auVar70);
  auVar69 = vmovddup_avx512vl(auVar60);
  auVar70 = vmovddup_avx512vl(auVar59);
  local_490 = ZEXT416((uint)(auVar56._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_490);
  auVar56 = vxorps_avx512vl(local_440._0_16_,auVar259._0_16_);
  local_3c0 = auVar56._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  uVar46 = 0;
  local_450 = vsubps_avx(auVar67,auVar58);
  local_460 = vsubps_avx512vl(auVar64,auVar67);
  local_470 = vsubps_avx512vl(_local_480,auVar64);
  local_5a0 = vsubps_avx(_local_530,local_520);
  local_5b0 = vsubps_avx512vl(_local_580,local_560);
  local_5c0 = vsubps_avx512vl(_local_590,local_570);
  _local_5d0 = vsubps_avx512vl(_local_550,local_540);
  auVar126 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar126);
  auVar126 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar126);
  auVar56 = ZEXT816(0x3f80000000000000);
  auVar117._32_32_ = auVar126._32_32_;
  auVar84 = auVar56;
LAB_017e3c26:
  do {
    auVar267 = ZEXT3264(local_440);
    auVar265 = ZEXT1664(auVar70);
    auVar60 = vshufps_avx(auVar84,auVar84,0x50);
    auVar251._8_4_ = 0x3f800000;
    auVar251._0_8_ = 0x3f8000003f800000;
    auVar251._12_4_ = 0x3f800000;
    auVar105._16_4_ = 0x3f800000;
    auVar105._0_16_ = auVar251;
    auVar105._20_4_ = 0x3f800000;
    auVar105._24_4_ = 0x3f800000;
    auVar105._28_4_ = 0x3f800000;
    auVar59 = vsubps_avx(auVar251,auVar60);
    fVar228 = auVar60._0_4_;
    fVar152 = auVar61._0_4_;
    auVar153._0_4_ = fVar152 * fVar228;
    fVar217 = auVar60._4_4_;
    fVar157 = auVar61._4_4_;
    auVar153._4_4_ = fVar157 * fVar217;
    fVar226 = auVar60._8_4_;
    auVar153._8_4_ = fVar152 * fVar226;
    fVar227 = auVar60._12_4_;
    auVar153._12_4_ = fVar157 * fVar227;
    fVar158 = auVar62._0_4_;
    auVar161._0_4_ = fVar158 * fVar228;
    fVar168 = auVar62._4_4_;
    auVar161._4_4_ = fVar168 * fVar217;
    auVar161._8_4_ = fVar158 * fVar226;
    auVar161._12_4_ = fVar168 * fVar227;
    fVar127 = auVar63._0_4_;
    auVar174._0_4_ = fVar127 * fVar228;
    fVar133 = auVar63._4_4_;
    auVar174._4_4_ = fVar133 * fVar217;
    auVar174._8_4_ = fVar127 * fVar226;
    auVar174._12_4_ = fVar133 * fVar227;
    fVar134 = auVar65._0_4_;
    auVar141._0_4_ = fVar134 * fVar228;
    fVar135 = auVar65._4_4_;
    auVar141._4_4_ = fVar135 * fVar217;
    auVar141._8_4_ = fVar134 * fVar226;
    auVar141._12_4_ = fVar135 * fVar227;
    auVar66 = vfmadd231ps_avx512vl(auVar153,auVar59,auVar57);
    auVar71 = vfmadd231ps_avx512vl(auVar161,auVar59,auVar68);
    auVar72 = vfmadd231ps_avx512vl(auVar174,auVar59,auVar69);
    auVar59 = vfmadd231ps_avx512vl(auVar141,auVar70,auVar59);
    auVar60 = vmovshdup_avx(auVar56);
    fVar217 = auVar56._0_4_;
    fVar228 = (auVar60._0_4_ - fVar217) * 0.04761905;
    auVar99._4_4_ = fVar217;
    auVar99._0_4_ = fVar217;
    auVar99._8_4_ = fVar217;
    auVar99._12_4_ = fVar217;
    auVar99._16_4_ = fVar217;
    auVar99._20_4_ = fVar217;
    auVar99._24_4_ = fVar217;
    auVar99._28_4_ = fVar217;
    auVar89._0_8_ = auVar60._0_8_;
    auVar89._8_8_ = auVar89._0_8_;
    auVar89._16_8_ = auVar89._0_8_;
    auVar89._24_8_ = auVar89._0_8_;
    auVar102 = vsubps_avx(auVar89,auVar99);
    uVar128 = auVar66._0_4_;
    auVar103._4_4_ = uVar128;
    auVar103._0_4_ = uVar128;
    auVar103._8_4_ = uVar128;
    auVar103._12_4_ = uVar128;
    auVar103._16_4_ = uVar128;
    auVar103._20_4_ = uVar128;
    auVar103._24_4_ = uVar128;
    auVar103._28_4_ = uVar128;
    auVar91._8_4_ = 1;
    auVar91._0_8_ = 0x100000001;
    auVar91._12_4_ = 1;
    auVar91._16_4_ = 1;
    auVar91._20_4_ = 1;
    auVar91._24_4_ = 1;
    auVar91._28_4_ = 1;
    auVar101 = ZEXT1632(auVar66);
    auVar100 = vpermps_avx2(auVar91,auVar101);
    auVar85 = vbroadcastss_avx512vl(auVar71);
    auVar95 = ZEXT1632(auVar71);
    auVar86 = vpermps_avx512vl(auVar91,auVar95);
    auVar87 = vbroadcastss_avx512vl(auVar72);
    auVar96 = ZEXT1632(auVar72);
    auVar88 = vpermps_avx512vl(auVar91,auVar96);
    auVar89 = vbroadcastss_avx512vl(auVar59);
    auVar98 = ZEXT1632(auVar59);
    auVar90 = vpermps_avx512vl(auVar91,auVar98);
    auVar104._4_4_ = fVar228;
    auVar104._0_4_ = fVar228;
    auVar104._8_4_ = fVar228;
    auVar104._12_4_ = fVar228;
    auVar104._16_4_ = fVar228;
    auVar104._20_4_ = fVar228;
    auVar104._24_4_ = fVar228;
    auVar104._28_4_ = fVar228;
    auVar97._8_4_ = 2;
    auVar97._0_8_ = 0x200000002;
    auVar97._12_4_ = 2;
    auVar97._16_4_ = 2;
    auVar97._20_4_ = 2;
    auVar97._24_4_ = 2;
    auVar97._28_4_ = 2;
    auVar91 = vpermps_avx512vl(auVar97,auVar101);
    auVar92 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar93 = vpermps_avx512vl(auVar92,auVar101);
    auVar94 = vpermps_avx512vl(auVar97,auVar95);
    auVar95 = vpermps_avx512vl(auVar92,auVar95);
    auVar101 = vpermps_avx2(auVar97,auVar96);
    auVar96 = vpermps_avx512vl(auVar92,auVar96);
    auVar97 = vpermps_avx512vl(auVar97,auVar98);
    auVar92 = vpermps_avx512vl(auVar92,auVar98);
    auVar60 = vfmadd132ps_fma(auVar102,auVar99,_DAT_01f7b040);
    auVar102 = vsubps_avx(auVar105,ZEXT1632(auVar60));
    auVar98 = vmulps_avx512vl(auVar85,ZEXT1632(auVar60));
    auVar105 = ZEXT1632(auVar60);
    auVar99 = vmulps_avx512vl(auVar86,auVar105);
    auVar59 = vfmadd231ps_fma(auVar98,auVar102,auVar103);
    auVar66 = vfmadd231ps_fma(auVar99,auVar102,auVar100);
    auVar98 = vmulps_avx512vl(auVar87,auVar105);
    auVar99 = vmulps_avx512vl(auVar88,auVar105);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar85);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar86);
    auVar85 = vmulps_avx512vl(auVar89,auVar105);
    auVar103 = ZEXT1632(auVar60);
    auVar86 = vmulps_avx512vl(auVar90,auVar103);
    auVar87 = vfmadd231ps_avx512vl(auVar85,auVar102,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar86,auVar102,auVar88);
    fVar226 = auVar60._0_4_;
    fVar227 = auVar60._4_4_;
    auVar85._4_4_ = fVar227 * auVar98._4_4_;
    auVar85._0_4_ = fVar226 * auVar98._0_4_;
    fVar229 = auVar60._8_4_;
    auVar85._8_4_ = fVar229 * auVar98._8_4_;
    fVar240 = auVar60._12_4_;
    auVar85._12_4_ = fVar240 * auVar98._12_4_;
    auVar85._16_4_ = auVar98._16_4_ * 0.0;
    auVar85._20_4_ = auVar98._20_4_ * 0.0;
    auVar85._24_4_ = auVar98._24_4_ * 0.0;
    auVar85._28_4_ = fVar217;
    auVar86._4_4_ = fVar227 * auVar99._4_4_;
    auVar86._0_4_ = fVar226 * auVar99._0_4_;
    auVar86._8_4_ = fVar229 * auVar99._8_4_;
    auVar86._12_4_ = fVar240 * auVar99._12_4_;
    auVar86._16_4_ = auVar99._16_4_ * 0.0;
    auVar86._20_4_ = auVar99._20_4_ * 0.0;
    auVar86._24_4_ = auVar99._24_4_ * 0.0;
    auVar86._28_4_ = auVar100._28_4_;
    auVar59 = vfmadd231ps_fma(auVar85,auVar102,ZEXT1632(auVar59));
    auVar66 = vfmadd231ps_fma(auVar86,auVar102,ZEXT1632(auVar66));
    auVar90._0_4_ = fVar226 * auVar87._0_4_;
    auVar90._4_4_ = fVar227 * auVar87._4_4_;
    auVar90._8_4_ = fVar229 * auVar87._8_4_;
    auVar90._12_4_ = fVar240 * auVar87._12_4_;
    auVar90._16_4_ = auVar87._16_4_ * 0.0;
    auVar90._20_4_ = auVar87._20_4_ * 0.0;
    auVar90._24_4_ = auVar87._24_4_ * 0.0;
    auVar90._28_4_ = 0;
    auVar100._4_4_ = fVar227 * auVar88._4_4_;
    auVar100._0_4_ = fVar226 * auVar88._0_4_;
    auVar100._8_4_ = fVar229 * auVar88._8_4_;
    auVar100._12_4_ = fVar240 * auVar88._12_4_;
    auVar100._16_4_ = auVar88._16_4_ * 0.0;
    auVar100._20_4_ = auVar88._20_4_ * 0.0;
    auVar100._24_4_ = auVar88._24_4_ * 0.0;
    auVar100._28_4_ = auVar87._28_4_;
    auVar71 = vfmadd231ps_fma(auVar90,auVar102,auVar98);
    auVar72 = vfmadd231ps_fma(auVar100,auVar102,auVar99);
    auVar87._28_4_ = auVar99._28_4_;
    auVar87._0_28_ =
         ZEXT1628(CONCAT412(fVar240 * auVar72._12_4_,
                            CONCAT48(fVar229 * auVar72._8_4_,
                                     CONCAT44(fVar227 * auVar72._4_4_,fVar226 * auVar72._0_4_))));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar240 * auVar71._12_4_,
                                                 CONCAT48(fVar229 * auVar71._8_4_,
                                                          CONCAT44(fVar227 * auVar71._4_4_,
                                                                   fVar226 * auVar71._0_4_)))),
                              auVar102,ZEXT1632(auVar59));
    auVar82 = vfmadd231ps_fma(auVar87,auVar102,ZEXT1632(auVar66));
    auVar100 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar59));
    auVar85 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar66));
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar100 = vmulps_avx512vl(auVar100,auVar86);
    auVar85 = vmulps_avx512vl(auVar85,auVar86);
    auVar98._0_4_ = fVar228 * auVar100._0_4_;
    auVar98._4_4_ = fVar228 * auVar100._4_4_;
    auVar98._8_4_ = fVar228 * auVar100._8_4_;
    auVar98._12_4_ = fVar228 * auVar100._12_4_;
    auVar98._16_4_ = fVar228 * auVar100._16_4_;
    auVar98._20_4_ = fVar228 * auVar100._20_4_;
    auVar98._24_4_ = fVar228 * auVar100._24_4_;
    auVar98._28_4_ = 0;
    auVar100 = vmulps_avx512vl(auVar104,auVar85);
    auVar66 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
    auVar85 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar144._0_4_ = auVar98._0_4_ + auVar80._0_4_;
    auVar144._4_4_ = auVar98._4_4_ + auVar80._4_4_;
    auVar144._8_4_ = auVar98._8_4_ + auVar80._8_4_;
    auVar144._12_4_ = auVar98._12_4_ + auVar80._12_4_;
    auVar144._16_4_ = auVar98._16_4_ + 0.0;
    auVar144._20_4_ = auVar98._20_4_ + 0.0;
    auVar144._24_4_ = auVar98._24_4_ + 0.0;
    auVar144._28_4_ = 0;
    auVar99 = ZEXT1632(auVar66);
    auVar88 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar99);
    auVar89 = vaddps_avx512vl(ZEXT1632(auVar82),auVar100);
    auVar90 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar99);
    auVar100 = vsubps_avx(auVar85,auVar88);
    auVar90 = vsubps_avx512vl(auVar87,auVar90);
    auVar88 = vmulps_avx512vl(auVar94,auVar103);
    auVar98 = vmulps_avx512vl(auVar95,auVar103);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,auVar91);
    auVar91 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar93);
    auVar93 = vmulps_avx512vl(auVar101,auVar103);
    auVar98 = vmulps_avx512vl(auVar96,auVar103);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar95);
    auVar95 = vmulps_avx512vl(auVar97,auVar103);
    auVar92 = vmulps_avx512vl(auVar92,auVar103);
    auVar59 = vfmadd231ps_fma(auVar95,auVar102,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar92,auVar102,auVar96);
    auVar92 = vmulps_avx512vl(auVar103,auVar93);
    auVar97 = ZEXT1632(auVar60);
    auVar95 = vmulps_avx512vl(auVar97,auVar94);
    auVar88 = vfmadd231ps_avx512vl(auVar92,auVar102,auVar88);
    auVar91 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar91);
    auVar101 = vmulps_avx512vl(auVar97,auVar101);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar240 * auVar59._12_4_,
                                            CONCAT48(fVar229 * auVar59._8_4_,
                                                     CONCAT44(fVar227 * auVar59._4_4_,
                                                              fVar226 * auVar59._0_4_)))),auVar102,
                         auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar101,auVar102,auVar94);
    auVar101._4_4_ = fVar227 * auVar92._4_4_;
    auVar101._0_4_ = fVar226 * auVar92._0_4_;
    auVar101._8_4_ = fVar229 * auVar92._8_4_;
    auVar101._12_4_ = fVar240 * auVar92._12_4_;
    auVar101._16_4_ = auVar92._16_4_ * 0.0;
    auVar101._20_4_ = auVar92._20_4_ * 0.0;
    auVar101._24_4_ = auVar92._24_4_ * 0.0;
    auVar101._28_4_ = auVar96._28_4_;
    auVar94 = vmulps_avx512vl(auVar97,auVar93);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,auVar88);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar102);
    auVar102 = vsubps_avx512vl(auVar92,auVar88);
    auVar88 = vsubps_avx512vl(auVar93,auVar91);
    auVar91 = vmulps_avx512vl(auVar102,auVar86);
    auVar86 = vmulps_avx512vl(auVar88,auVar86);
    fVar217 = fVar228 * auVar91._0_4_;
    fVar226 = fVar228 * auVar91._4_4_;
    auVar102._4_4_ = fVar226;
    auVar102._0_4_ = fVar217;
    fVar227 = fVar228 * auVar91._8_4_;
    auVar102._8_4_ = fVar227;
    fVar229 = fVar228 * auVar91._12_4_;
    auVar102._12_4_ = fVar229;
    fVar240 = fVar228 * auVar91._16_4_;
    auVar102._16_4_ = fVar240;
    fVar241 = fVar228 * auVar91._20_4_;
    auVar102._20_4_ = fVar241;
    fVar228 = fVar228 * auVar91._24_4_;
    auVar102._24_4_ = fVar228;
    auVar102._28_4_ = auVar91._28_4_;
    auVar86 = vmulps_avx512vl(auVar104,auVar86);
    auVar92 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar99);
    auVar93 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar99);
    auVar216._0_4_ = auVar101._0_4_ + fVar217;
    auVar216._4_4_ = auVar101._4_4_ + fVar226;
    auVar216._8_4_ = auVar101._8_4_ + fVar227;
    auVar216._12_4_ = auVar101._12_4_ + fVar229;
    auVar216._16_4_ = auVar101._16_4_ + fVar240;
    auVar216._20_4_ = auVar101._20_4_ + fVar241;
    auVar216._24_4_ = auVar101._24_4_ + fVar228;
    auVar216._28_4_ = auVar101._28_4_ + auVar91._28_4_;
    auVar102 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar91 = vaddps_avx512vl(auVar94,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,ZEXT1632(auVar66));
    auVar102 = vsubps_avx(auVar92,auVar102);
    auVar86 = vsubps_avx512vl(auVar93,auVar86);
    auVar156 = ZEXT1632(auVar80);
    auVar88 = vsubps_avx512vl(auVar101,auVar156);
    auVar167 = ZEXT1632(auVar82);
    auVar95 = vsubps_avx512vl(auVar94,auVar167);
    auVar96 = vsubps_avx512vl(auVar92,auVar85);
    auVar88 = vaddps_avx512vl(auVar88,auVar96);
    auVar96 = vsubps_avx512vl(auVar93,auVar87);
    auVar95 = vaddps_avx512vl(auVar95,auVar96);
    auVar96 = vmulps_avx512vl(auVar167,auVar88);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar156,auVar95);
    auVar97 = vmulps_avx512vl(auVar89,auVar88);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar144,auVar95);
    auVar98 = vmulps_avx512vl(auVar90,auVar88);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar100,auVar95);
    auVar99 = vmulps_avx512vl(auVar87,auVar88);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar85,auVar95);
    auVar103 = vmulps_avx512vl(auVar94,auVar88);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar101,auVar95);
    auVar104 = vmulps_avx512vl(auVar91,auVar88);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar216,auVar95);
    auVar105 = vmulps_avx512vl(auVar86,auVar88);
    auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar102,auVar95);
    auVar88 = vmulps_avx512vl(auVar93,auVar88);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar92,auVar95);
    auVar95 = vminps_avx512vl(auVar96,auVar97);
    auVar96 = vmaxps_avx512vl(auVar96,auVar97);
    auVar97 = vminps_avx512vl(auVar98,auVar99);
    auVar95 = vminps_avx512vl(auVar95,auVar97);
    auVar97 = vmaxps_avx512vl(auVar98,auVar99);
    auVar96 = vmaxps_avx512vl(auVar96,auVar97);
    auVar97 = vminps_avx512vl(auVar103,auVar104);
    auVar98 = vmaxps_avx512vl(auVar103,auVar104);
    auVar99 = vminps_avx512vl(auVar105,auVar88);
    auVar97 = vminps_avx512vl(auVar97,auVar99);
    auVar95 = vminps_avx512vl(auVar95,auVar97);
    auVar88 = vmaxps_avx512vl(auVar105,auVar88);
    auVar88 = vmaxps_avx512vl(auVar98,auVar88);
    auVar96 = vmaxps_avx512vl(auVar96,auVar88);
    uVar22 = vcmpps_avx512vl(auVar95,local_440,2);
    auVar88._4_4_ = uStack_3bc;
    auVar88._0_4_ = local_3c0;
    auVar88._8_4_ = uStack_3b8;
    auVar88._12_4_ = uStack_3b4;
    auVar88._16_4_ = uStack_3b0;
    auVar88._20_4_ = uStack_3ac;
    auVar88._24_4_ = uStack_3a8;
    auVar88._28_4_ = uStack_3a4;
    uVar23 = vcmpps_avx512vl(auVar96,auVar88,5);
    bVar44 = (byte)uVar22 & (byte)uVar23 & 0x7f;
    if (bVar44 != 0) {
      auVar95 = vsubps_avx512vl(auVar85,auVar156);
      auVar96 = vsubps_avx512vl(auVar87,auVar167);
      auVar97 = vsubps_avx512vl(auVar92,auVar101);
      auVar95 = vaddps_avx512vl(auVar95,auVar97);
      auVar97 = vsubps_avx512vl(auVar93,auVar94);
      auVar96 = vaddps_avx512vl(auVar96,auVar97);
      auVar97 = vmulps_avx512vl(auVar167,auVar95);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar96,auVar156);
      auVar89 = vmulps_avx512vl(auVar89,auVar95);
      auVar89 = vfnmadd213ps_avx512vl(auVar144,auVar96,auVar89);
      auVar90 = vmulps_avx512vl(auVar90,auVar95);
      auVar90 = vfnmadd213ps_avx512vl(auVar100,auVar96,auVar90);
      auVar100 = vmulps_avx512vl(auVar87,auVar95);
      auVar87 = vfnmadd231ps_avx512vl(auVar100,auVar96,auVar85);
      auVar100 = vmulps_avx512vl(auVar94,auVar95);
      auVar94 = vfnmadd231ps_avx512vl(auVar100,auVar96,auVar101);
      auVar100 = vmulps_avx512vl(auVar91,auVar95);
      auVar91 = vfnmadd213ps_avx512vl(auVar216,auVar96,auVar100);
      auVar100 = vmulps_avx512vl(auVar86,auVar95);
      auVar98 = vfnmadd213ps_avx512vl(auVar102,auVar96,auVar100);
      auVar102 = vmulps_avx512vl(auVar93,auVar95);
      auVar92 = vfnmadd231ps_avx512vl(auVar102,auVar92,auVar96);
      auVar100 = vminps_avx(auVar97,auVar89);
      auVar102 = vmaxps_avx(auVar97,auVar89);
      auVar85 = vminps_avx(auVar90,auVar87);
      auVar85 = vminps_avx(auVar100,auVar85);
      auVar100 = vmaxps_avx(auVar90,auVar87);
      auVar102 = vmaxps_avx(auVar102,auVar100);
      auVar101 = vminps_avx(auVar94,auVar91);
      auVar100 = vmaxps_avx(auVar94,auVar91);
      auVar86 = vminps_avx(auVar98,auVar92);
      auVar101 = vminps_avx(auVar101,auVar86);
      auVar101 = vminps_avx(auVar85,auVar101);
      auVar85 = vmaxps_avx(auVar98,auVar92);
      auVar100 = vmaxps_avx(auVar100,auVar85);
      auVar102 = vmaxps_avx(auVar102,auVar100);
      uVar22 = vcmpps_avx512vl(auVar102,auVar88,5);
      uVar23 = vcmpps_avx512vl(auVar101,local_440,2);
      bVar44 = bVar44 & (byte)uVar22 & (byte)uVar23;
      if (bVar44 != 0) {
        auStack_5f0[uVar46] = (uint)bVar44;
        uVar22 = vmovlps_avx(auVar56);
        (&uStack_420)[uVar46] = uVar22;
        uVar1 = vmovlps_avx(auVar84);
        auStack_3a0[uVar46] = uVar1;
        uVar46 = (ulong)((int)uVar46 + 1);
      }
    }
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar126 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar259 = ZEXT1664(auVar56);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar260 = ZEXT3264(auVar102);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar261 = ZEXT1664(auVar56);
    auVar118._32_32_ = auVar117._32_32_;
    auVar118._0_32_ = _DAT_01fb9fe0;
    auVar262 = ZEXT3264(_DAT_01fb9fe0);
LAB_017e4128:
    do {
      do {
        do {
          if ((int)uVar46 == 0) {
            uVar128 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar27._4_4_ = uVar128;
            auVar27._0_4_ = uVar128;
            auVar27._8_4_ = uVar128;
            auVar27._12_4_ = uVar128;
            uVar22 = vcmpps_avx512vl(local_5e0,auVar27,2);
            uVar51 = (ulong)((uint)uVar51 & local_628 & (uint)uVar22);
            goto LAB_017e351c;
          }
          uVar45 = (int)uVar46 - 1;
          uVar47 = (ulong)uVar45;
          uVar6 = auStack_5f0[uVar47];
          auVar84._8_8_ = 0;
          auVar84._0_8_ = auStack_3a0[uVar47];
          uVar1 = 0;
          for (uVar50 = (ulong)uVar6; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000)
          {
            uVar1 = uVar1 + 1;
          }
          uVar49 = uVar6 - 1 & uVar6;
          bVar54 = uVar49 == 0;
          auStack_5f0[uVar47] = uVar49;
          if (bVar54) {
            uVar46 = (ulong)uVar45;
          }
          auVar122._8_8_ = 0;
          auVar122._0_8_ = uVar1;
          auVar56 = vpunpcklqdq_avx(auVar122,ZEXT416((int)uVar1 + 1));
          auVar117._32_32_ = auVar118._32_32_;
          auVar56 = vcvtqq2ps_avx512vl(auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar261._0_16_);
          uVar128 = *(undefined4 *)((long)&uStack_420 + uVar47 * 8 + 4);
          auVar24._4_4_ = uVar128;
          auVar24._0_4_ = uVar128;
          auVar24._8_4_ = uVar128;
          auVar24._12_4_ = uVar128;
          auVar60 = vmulps_avx512vl(auVar56,auVar24);
          auVar59 = auVar264._0_16_;
          auVar56 = vsubps_avx512vl(auVar59,auVar56);
          uVar128 = *(undefined4 *)(&uStack_420 + uVar47);
          auVar25._4_4_ = uVar128;
          auVar25._0_4_ = uVar128;
          auVar25._8_4_ = uVar128;
          auVar25._12_4_ = uVar128;
          auVar56 = vfmadd231ps_avx512vl(auVar60,auVar56,auVar25);
          auVar60 = vmovshdup_avx(auVar56);
          fVar228 = auVar60._0_4_ - auVar56._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar228));
          if (uVar6 == 0 || bVar54) goto LAB_017e3c26;
          auVar60 = vshufps_avx(auVar84,auVar84,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar228));
          auVar72 = vsubps_avx512vl(auVar59,auVar60);
          fVar217 = auVar60._0_4_;
          auVar162._0_4_ = fVar217 * fVar152;
          fVar226 = auVar60._4_4_;
          auVar162._4_4_ = fVar226 * fVar157;
          fVar227 = auVar60._8_4_;
          auVar162._8_4_ = fVar227 * fVar152;
          fVar229 = auVar60._12_4_;
          auVar162._12_4_ = fVar229 * fVar157;
          auVar175._0_4_ = fVar217 * fVar158;
          auVar175._4_4_ = fVar226 * fVar168;
          auVar175._8_4_ = fVar227 * fVar158;
          auVar175._12_4_ = fVar229 * fVar168;
          auVar184._0_4_ = fVar217 * fVar127;
          auVar184._4_4_ = fVar226 * fVar133;
          auVar184._8_4_ = fVar227 * fVar127;
          auVar184._12_4_ = fVar229 * fVar133;
          auVar147._0_4_ = fVar217 * fVar134;
          auVar147._4_4_ = fVar226 * fVar135;
          auVar147._8_4_ = fVar227 * fVar134;
          auVar147._12_4_ = fVar229 * fVar135;
          auVar60 = vfmadd231ps_fma(auVar162,auVar72,auVar57);
          auVar66 = vfmadd231ps_fma(auVar175,auVar72,auVar68);
          auVar71 = vfmadd231ps_fma(auVar184,auVar72,auVar69);
          auVar72 = vfmadd231ps_fma(auVar147,auVar72,auVar70);
          auVar92._16_16_ = auVar60;
          auVar92._0_16_ = auVar60;
          auVar93._16_16_ = auVar66;
          auVar93._0_16_ = auVar66;
          auVar95._16_16_ = auVar71;
          auVar95._0_16_ = auVar71;
          auVar100 = vpermps_avx512vl(auVar262._0_32_,ZEXT1632(auVar56));
          auVar102 = vsubps_avx(auVar93,auVar92);
          auVar66 = vfmadd213ps_fma(auVar102,auVar100,auVar92);
          auVar102 = vsubps_avx(auVar95,auVar93);
          auVar80 = vfmadd213ps_fma(auVar102,auVar100,auVar93);
          auVar60 = vsubps_avx(auVar72,auVar71);
          auVar94._16_16_ = auVar60;
          auVar94._0_16_ = auVar60;
          auVar60 = vfmadd213ps_fma(auVar94,auVar100,auVar95);
          auVar102 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar66));
          auVar66 = vfmadd213ps_fma(auVar102,auVar100,ZEXT1632(auVar66));
          auVar102 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar80));
          auVar60 = vfmadd213ps_fma(auVar102,auVar100,ZEXT1632(auVar80));
          auVar102 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar66));
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar102,auVar100);
          auVar117._0_32_ = vmulps_avx512vl(auVar102,auVar260._0_32_);
          auVar118._16_48_ = auVar117._16_48_;
          auVar60 = vmulss_avx512f(ZEXT416((uint)fVar228),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar217 = auVar60._0_4_;
          auVar185._0_8_ =
               CONCAT44(auVar159._4_4_ + fVar217 * auVar117._4_4_,
                        auVar159._0_4_ + fVar217 * auVar117._0_4_);
          auVar185._8_4_ = auVar159._8_4_ + fVar217 * auVar117._8_4_;
          auVar185._12_4_ = auVar159._12_4_ + fVar217 * auVar117._12_4_;
          auVar163._0_4_ = fVar217 * auVar117._16_4_;
          auVar163._4_4_ = fVar217 * auVar117._20_4_;
          auVar163._8_4_ = fVar217 * auVar117._24_4_;
          auVar163._12_4_ = fVar217 * auVar117._28_4_;
          auVar79 = vsubps_avx((undefined1  [16])0x0,auVar163);
          auVar80 = vshufpd_avx(auVar159,auVar159,3);
          auVar82 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar60 = vsubps_avx(auVar80,auVar159);
          auVar66 = vsubps_avx(auVar82,(undefined1  [16])0x0);
          auVar203._0_4_ = auVar60._0_4_ + auVar66._0_4_;
          auVar203._4_4_ = auVar60._4_4_ + auVar66._4_4_;
          auVar203._8_4_ = auVar60._8_4_ + auVar66._8_4_;
          auVar203._12_4_ = auVar60._12_4_ + auVar66._12_4_;
          auVar60 = vshufps_avx(auVar159,auVar159,0xb1);
          auVar66 = vshufps_avx(auVar185,auVar185,0xb1);
          auVar71 = vshufps_avx(auVar79,auVar79,0xb1);
          auVar72 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar252._4_4_ = auVar203._0_4_;
          auVar252._0_4_ = auVar203._0_4_;
          auVar252._8_4_ = auVar203._0_4_;
          auVar252._12_4_ = auVar203._0_4_;
          auVar75 = vshufps_avx(auVar203,auVar203,0x55);
          fVar217 = auVar75._0_4_;
          auVar214._0_4_ = auVar60._0_4_ * fVar217;
          fVar226 = auVar75._4_4_;
          auVar214._4_4_ = auVar60._4_4_ * fVar226;
          fVar227 = auVar75._8_4_;
          auVar214._8_4_ = auVar60._8_4_ * fVar227;
          fVar229 = auVar75._12_4_;
          auVar214._12_4_ = auVar60._12_4_ * fVar229;
          auVar219._0_4_ = auVar66._0_4_ * fVar217;
          auVar219._4_4_ = auVar66._4_4_ * fVar226;
          auVar219._8_4_ = auVar66._8_4_ * fVar227;
          auVar219._12_4_ = auVar66._12_4_ * fVar229;
          auVar232._0_4_ = auVar71._0_4_ * fVar217;
          auVar232._4_4_ = auVar71._4_4_ * fVar226;
          auVar232._8_4_ = auVar71._8_4_ * fVar227;
          auVar232._12_4_ = auVar71._12_4_ * fVar229;
          auVar204._0_4_ = auVar72._0_4_ * fVar217;
          auVar204._4_4_ = auVar72._4_4_ * fVar226;
          auVar204._8_4_ = auVar72._8_4_ * fVar227;
          auVar204._12_4_ = auVar72._12_4_ * fVar229;
          auVar60 = vfmadd231ps_fma(auVar214,auVar252,auVar159);
          auVar66 = vfmadd231ps_fma(auVar219,auVar252,auVar185);
          auVar77 = vfmadd231ps_fma(auVar232,auVar252,auVar79);
          auVar78 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar252);
          auVar75 = vshufpd_avx(auVar60,auVar60,1);
          auVar76 = vshufpd_avx(auVar66,auVar66,1);
          auVar73 = vshufpd_avx512vl(auVar77,auVar77,1);
          auVar74 = vshufpd_avx512vl(auVar78,auVar78,1);
          auVar71 = vminss_avx(auVar60,auVar66);
          auVar60 = vmaxss_avx(auVar66,auVar60);
          auVar72 = vminss_avx(auVar77,auVar78);
          auVar66 = vmaxss_avx(auVar78,auVar77);
          auVar71 = vminss_avx(auVar71,auVar72);
          auVar60 = vmaxss_avx(auVar66,auVar60);
          auVar72 = vminss_avx(auVar75,auVar76);
          auVar66 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vminss_avx512f(auVar73,auVar74);
          auVar76 = vmaxss_avx512f(auVar74,auVar73);
          auVar66 = vmaxss_avx(auVar76,auVar66);
          auVar118._0_16_ = vminss_avx512f(auVar72,auVar75);
          vucomiss_avx512f(auVar71);
          fVar226 = auVar66._0_4_;
          fVar217 = auVar60._0_4_;
          if (4 < (uint)uVar46) {
            bVar55 = fVar226 == -0.0001;
            bVar52 = NAN(fVar226);
            if (fVar226 <= -0.0001) goto LAB_017e4351;
            break;
          }
LAB_017e4351:
          auVar72 = vucomiss_avx512f(auVar118._0_16_);
          bVar55 = fVar226 <= -0.0001;
          bVar53 = -0.0001 < fVar217;
          bVar52 = bVar55;
          if (!bVar55) break;
          uVar22 = vcmpps_avx512vl(auVar71,auVar72,5);
          uVar23 = vcmpps_avx512vl(auVar118._0_16_,auVar72,5);
          uVar45 = (uint)uVar22 & (uint)uVar23;
          bVar11 = (uVar45 & 1) == 0;
          bVar55 = bVar53 && bVar11;
          bVar52 = bVar53 && (uVar45 & 1) == 0;
        } while (!bVar53 || !bVar11);
        auVar76 = vxorps_avx512vl(auVar265._0_16_,auVar265._0_16_);
        auVar265 = ZEXT1664(auVar76);
        vcmpss_avx512f(auVar71,auVar76,1);
        uVar22 = vcmpss_avx512f(auVar60,auVar76,1);
        bVar53 = (bool)((byte)uVar22 & 1);
        auVar106._16_48_ = auVar118._16_48_;
        auVar106._0_16_ = auVar266._0_16_;
        auVar119._4_60_ = auVar106._4_60_;
        auVar119._0_4_ = (float)((uint)bVar53 * -0x40800000 + (uint)!bVar53 * auVar266._0_4_);
        vucomiss_avx512f(auVar119._0_16_);
        bVar52 = (bool)(!bVar55 | bVar52);
        bVar53 = bVar52 == false;
        auVar108._16_48_ = auVar118._16_48_;
        auVar108._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar107._4_60_ = auVar108._4_60_;
        auVar107._0_4_ = (uint)bVar52 * auVar76._0_4_ + (uint)!bVar52 * 0x7f800000;
        auVar75 = auVar107._0_16_;
        auVar110._16_48_ = auVar118._16_48_;
        auVar110._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar109._4_60_ = auVar110._4_60_;
        auVar109._0_4_ = (uint)bVar52 * auVar76._0_4_ + (uint)!bVar52 * -0x800000;
        auVar72 = auVar109._0_16_;
        auVar77 = vxorps_avx512vl(auVar267._0_16_,auVar267._0_16_);
        auVar267 = ZEXT1664(auVar77);
        uVar22 = vcmpss_avx512f(auVar118._0_16_,auVar76,1);
        bVar55 = (bool)((byte)uVar22 & 1);
        auVar112._16_48_ = auVar118._16_48_;
        auVar112._0_16_ = auVar266._0_16_;
        auVar111._4_60_ = auVar112._4_60_;
        auVar111._0_4_ = (float)((uint)bVar55 * -0x40800000 + (uint)!bVar55 * auVar266._0_4_);
        vucomiss_avx512f(auVar111._0_16_);
        if ((bVar52) || (bVar53)) {
          auVar76 = vucomiss_avx512f(auVar71);
          if ((bVar52) || (bVar53)) {
            auVar78 = vxorps_avx512vl(auVar71,auVar259._0_16_);
            auVar71 = vsubss_avx512f(auVar76,auVar71);
            auVar71 = vdivss_avx512f(auVar78,auVar71);
            auVar76 = vsubss_avx512f(ZEXT416(0x3f800000),auVar71);
            auVar76 = vfmadd213ss_avx512f(auVar76,auVar77,auVar71);
            auVar71 = auVar76;
          }
          else {
            auVar71 = vxorps_avx512vl(auVar76,auVar76);
            vucomiss_avx512f(auVar71);
            auVar76 = ZEXT416(0x3f800000);
            if ((bVar52) || (bVar53)) {
              auVar76 = SUB6416(ZEXT464(0xff800000),0);
              auVar71 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar75 = vminss_avx512f(auVar75,auVar71);
          auVar72 = vmaxss_avx(auVar76,auVar72);
        }
        auVar266 = ZEXT464(0x3f800000);
        uVar22 = vcmpss_avx512f(auVar66,auVar77,1);
        bVar55 = (bool)((byte)uVar22 & 1);
        auVar66 = auVar266._0_16_;
        fVar227 = (float)((uint)bVar55 * -0x40800000 + (uint)!bVar55 * 0x3f800000);
        if ((auVar119._0_4_ != fVar227) || (NAN(auVar119._0_4_) || NAN(fVar227))) {
          if ((fVar226 != fVar217) || (NAN(fVar226) || NAN(fVar217))) {
            auVar60 = vxorps_avx512vl(auVar60,auVar259._0_16_);
            auVar205._0_4_ = auVar60._0_4_ / (fVar226 - fVar217);
            auVar205._4_12_ = auVar60._4_12_;
            auVar60 = vsubss_avx512f(auVar66,auVar205);
            auVar60 = vfmadd213ss_avx512f(auVar60,auVar77,auVar205);
            auVar71 = auVar60;
          }
          else if ((fVar217 != 0.0) ||
                  (auVar60 = auVar66, auVar71 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar217))) {
            auVar60 = SUB6416(ZEXT464(0xff800000),0);
            auVar71 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar75 = vminss_avx(auVar75,auVar71);
          auVar72 = vmaxss_avx(auVar60,auVar72);
        }
        bVar55 = auVar111._0_4_ != fVar227;
        auVar60 = vminss_avx512f(auVar75,auVar66);
        auVar114._16_48_ = auVar118._16_48_;
        auVar114._0_16_ = auVar75;
        auVar113._4_60_ = auVar114._4_60_;
        auVar113._0_4_ = (uint)bVar55 * auVar60._0_4_ + (uint)!bVar55 * auVar75._0_4_;
        auVar60 = vmaxss_avx512f(auVar66,auVar72);
        auVar116._16_48_ = auVar118._16_48_;
        auVar116._0_16_ = auVar72;
        auVar115._4_60_ = auVar116._4_60_;
        auVar115._0_4_ = (uint)bVar55 * auVar60._0_4_ + (uint)!bVar55 * auVar72._0_4_;
        auVar60 = vmaxss_avx512f(auVar77,auVar113._0_16_);
        auVar118._0_16_ = vminss_avx512f(auVar115._0_16_,auVar66);
      } while (auVar118._0_4_ < auVar60._0_4_);
      auVar78 = vmaxss_avx512f(auVar77,ZEXT416((uint)(auVar60._0_4_ + -0.1)));
      auVar73 = vminss_avx512f(ZEXT416((uint)(auVar118._0_4_ + 0.1)),auVar66);
      auVar148._0_8_ = auVar159._0_8_;
      auVar148._8_8_ = auVar148._0_8_;
      auVar220._8_8_ = auVar185._0_8_;
      auVar220._0_8_ = auVar185._0_8_;
      auVar233._8_8_ = auVar79._0_8_;
      auVar233._0_8_ = auVar79._0_8_;
      auVar60 = vshufpd_avx(auVar185,auVar185,3);
      auVar71 = vshufpd_avx(auVar79,auVar79,3);
      auVar72 = vshufps_avx(auVar78,auVar73,0);
      auVar79 = vsubps_avx512vl(auVar59,auVar72);
      fVar217 = auVar72._0_4_;
      auVar176._0_4_ = fVar217 * auVar80._0_4_;
      fVar226 = auVar72._4_4_;
      auVar176._4_4_ = fVar226 * auVar80._4_4_;
      fVar227 = auVar72._8_4_;
      auVar176._8_4_ = fVar227 * auVar80._8_4_;
      fVar229 = auVar72._12_4_;
      auVar176._12_4_ = fVar229 * auVar80._12_4_;
      auVar186._0_4_ = fVar217 * auVar60._0_4_;
      auVar186._4_4_ = fVar226 * auVar60._4_4_;
      auVar186._8_4_ = fVar227 * auVar60._8_4_;
      auVar186._12_4_ = fVar229 * auVar60._12_4_;
      auVar254._0_4_ = auVar71._0_4_ * fVar217;
      auVar254._4_4_ = auVar71._4_4_ * fVar226;
      auVar254._8_4_ = auVar71._8_4_ * fVar227;
      auVar254._12_4_ = auVar71._12_4_ * fVar229;
      auVar164._0_4_ = fVar217 * auVar82._0_4_;
      auVar164._4_4_ = fVar226 * auVar82._4_4_;
      auVar164._8_4_ = fVar227 * auVar82._8_4_;
      auVar164._12_4_ = fVar229 * auVar82._12_4_;
      auVar82 = vfmadd231ps_fma(auVar176,auVar79,auVar148);
      auVar75 = vfmadd231ps_fma(auVar186,auVar79,auVar220);
      auVar76 = vfmadd231ps_fma(auVar254,auVar79,auVar233);
      auVar79 = vfmadd231ps_fma(auVar164,auVar79,ZEXT816(0));
      auVar71 = vsubss_avx512f(auVar66,auVar78);
      auVar60 = vmovshdup_avx(auVar84);
      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar78._0_4_)),auVar84,auVar71);
      auVar71 = vsubss_avx512f(auVar66,auVar73);
      auVar180 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar73._0_4_)),auVar84,auVar71);
      auVar78 = vdivss_avx512f(auVar66,ZEXT416((uint)fVar228));
      auVar60 = vsubps_avx(auVar75,auVar82);
      auVar121 = auVar126._0_16_;
      auVar72 = vmulps_avx512vl(auVar60,auVar121);
      auVar60 = vsubps_avx(auVar76,auVar75);
      auVar80 = vmulps_avx512vl(auVar60,auVar121);
      auVar60 = vsubps_avx(auVar79,auVar76);
      auVar60 = vmulps_avx512vl(auVar60,auVar121);
      auVar71 = vminps_avx(auVar80,auVar60);
      auVar60 = vmaxps_avx(auVar80,auVar60);
      auVar71 = vminps_avx(auVar72,auVar71);
      auVar60 = vmaxps_avx(auVar72,auVar60);
      auVar72 = vshufpd_avx(auVar71,auVar71,3);
      auVar80 = vshufpd_avx(auVar60,auVar60,3);
      auVar71 = vminps_avx(auVar71,auVar72);
      auVar60 = vmaxps_avx(auVar60,auVar80);
      fVar228 = auVar78._0_4_;
      auVar206._0_4_ = auVar71._0_4_ * fVar228;
      auVar206._4_4_ = auVar71._4_4_ * fVar228;
      auVar206._8_4_ = auVar71._8_4_ * fVar228;
      auVar206._12_4_ = auVar71._12_4_ * fVar228;
      auVar193._0_4_ = fVar228 * auVar60._0_4_;
      auVar193._4_4_ = fVar228 * auVar60._4_4_;
      auVar193._8_4_ = fVar228 * auVar60._8_4_;
      auVar193._12_4_ = fVar228 * auVar60._12_4_;
      auVar78 = vdivss_avx512f(auVar66,ZEXT416((uint)(auVar180._0_4_ - auVar74._0_4_)));
      auVar60 = vshufpd_avx(auVar82,auVar82,3);
      auVar71 = vshufpd_avx(auVar75,auVar75,3);
      auVar72 = vshufpd_avx(auVar76,auVar76,3);
      auVar80 = vshufpd_avx(auVar79,auVar79,3);
      auVar60 = vsubps_avx(auVar60,auVar82);
      auVar82 = vsubps_avx(auVar71,auVar75);
      auVar75 = vsubps_avx(auVar72,auVar76);
      auVar80 = vsubps_avx(auVar80,auVar79);
      auVar71 = vminps_avx(auVar60,auVar82);
      auVar60 = vmaxps_avx(auVar60,auVar82);
      auVar72 = vminps_avx(auVar75,auVar80);
      auVar72 = vminps_avx(auVar71,auVar72);
      auVar71 = vmaxps_avx(auVar75,auVar80);
      auVar60 = vmaxps_avx(auVar60,auVar71);
      fVar228 = auVar78._0_4_;
      auVar234._0_4_ = fVar228 * auVar72._0_4_;
      auVar234._4_4_ = fVar228 * auVar72._4_4_;
      auVar234._8_4_ = fVar228 * auVar72._8_4_;
      auVar234._12_4_ = fVar228 * auVar72._12_4_;
      auVar221._0_4_ = fVar228 * auVar60._0_4_;
      auVar221._4_4_ = fVar228 * auVar60._4_4_;
      auVar221._8_4_ = fVar228 * auVar60._8_4_;
      auVar221._12_4_ = fVar228 * auVar60._12_4_;
      auVar80 = vinsertps_avx(auVar56,auVar74,0x10);
      auVar81 = vpermt2ps_avx512vl(auVar56,_DAT_01fb9f90,auVar180);
      auVar132._0_4_ = auVar80._0_4_ + auVar81._0_4_;
      auVar132._4_4_ = auVar80._4_4_ + auVar81._4_4_;
      auVar132._8_4_ = auVar80._8_4_ + auVar81._8_4_;
      auVar132._12_4_ = auVar80._12_4_ + auVar81._12_4_;
      auVar26._8_4_ = 0x3f000000;
      auVar26._0_8_ = 0x3f0000003f000000;
      auVar26._12_4_ = 0x3f000000;
      auVar78 = vmulps_avx512vl(auVar132,auVar26);
      auVar71 = vshufps_avx(auVar78,auVar78,0x54);
      uVar128 = auVar78._0_4_;
      auVar142._4_4_ = uVar128;
      auVar142._0_4_ = uVar128;
      auVar142._8_4_ = uVar128;
      auVar142._12_4_ = uVar128;
      auVar72 = vfmadd213ps_fma(local_450,auVar142,auVar58);
      auVar82 = vfmadd213ps_fma(local_460,auVar142,auVar67);
      auVar75 = vfmadd213ps_fma(local_470,auVar142,auVar64);
      auVar60 = vsubps_avx(auVar82,auVar72);
      auVar72 = vfmadd213ps_fma(auVar60,auVar142,auVar72);
      auVar60 = vsubps_avx(auVar75,auVar82);
      auVar60 = vfmadd213ps_fma(auVar60,auVar142,auVar82);
      auVar60 = vsubps_avx(auVar60,auVar72);
      auVar72 = vfmadd231ps_fma(auVar72,auVar60,auVar142);
      auVar76 = vmulps_avx512vl(auVar60,auVar121);
      auVar245._8_8_ = auVar72._0_8_;
      auVar245._0_8_ = auVar72._0_8_;
      auVar60 = vshufpd_avx(auVar72,auVar72,3);
      auVar72 = vshufps_avx(auVar78,auVar78,0x55);
      auVar82 = vsubps_avx(auVar60,auVar245);
      auVar75 = vfmadd231ps_fma(auVar245,auVar72,auVar82);
      auVar255._8_8_ = auVar76._0_8_;
      auVar255._0_8_ = auVar76._0_8_;
      auVar60 = vshufpd_avx(auVar76,auVar76,3);
      auVar60 = vsubps_avx512vl(auVar60,auVar255);
      auVar60 = vfmadd213ps_avx512vl(auVar60,auVar72,auVar255);
      auVar143._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
      auVar143._8_4_ = auVar82._8_4_ ^ 0x80000000;
      auVar143._12_4_ = auVar82._12_4_ ^ 0x80000000;
      auVar72 = vmovshdup_avx512vl(auVar60);
      auVar256._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
      auVar256._8_4_ = auVar72._8_4_ ^ 0x80000000;
      auVar256._12_4_ = auVar72._12_4_ ^ 0x80000000;
      auVar76 = vmovshdup_avx512vl(auVar82);
      auVar79 = vpermt2ps_avx512vl(auVar256,ZEXT416(5),auVar82);
      auVar265 = ZEXT464(0x40400000);
      auVar72 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar72._0_4_ * auVar82._0_4_)),auVar60,auVar76);
      auVar82 = vpermt2ps_avx512vl(auVar60,SUB6416(ZEXT464(4),0),auVar143);
      auVar165._0_4_ = auVar72._0_4_;
      auVar165._4_4_ = auVar165._0_4_;
      auVar165._8_4_ = auVar165._0_4_;
      auVar165._12_4_ = auVar165._0_4_;
      auVar60 = vdivps_avx(auVar79,auVar165);
      auVar83 = vdivps_avx512vl(auVar82,auVar165);
      fVar228 = auVar75._0_4_;
      auVar72 = vshufps_avx(auVar75,auVar75,0x55);
      auVar246._0_4_ = fVar228 * auVar60._0_4_ + auVar72._0_4_ * auVar83._0_4_;
      auVar246._4_4_ = fVar228 * auVar60._4_4_ + auVar72._4_4_ * auVar83._4_4_;
      auVar246._8_4_ = fVar228 * auVar60._8_4_ + auVar72._8_4_ * auVar83._8_4_;
      auVar246._12_4_ = fVar228 * auVar60._12_4_ + auVar72._12_4_ * auVar83._12_4_;
      auVar159 = vsubps_avx(auVar71,auVar246);
      auVar72 = vmovshdup_avx(auVar60);
      auVar71 = vinsertps_avx(auVar206,auVar234,0x1c);
      auVar257._0_4_ = auVar72._0_4_ * auVar71._0_4_;
      auVar257._4_4_ = auVar72._4_4_ * auVar71._4_4_;
      auVar257._8_4_ = auVar72._8_4_ * auVar71._8_4_;
      auVar257._12_4_ = auVar72._12_4_ * auVar71._12_4_;
      auVar73 = vinsertps_avx512f(auVar193,auVar221,0x1c);
      auVar72 = vmulps_avx512vl(auVar72,auVar73);
      auVar79 = vminps_avx512vl(auVar257,auVar72);
      auVar75 = vmaxps_avx(auVar72,auVar257);
      auVar76 = vmovshdup_avx(auVar83);
      auVar72 = vinsertps_avx(auVar234,auVar206,0x4c);
      auVar235._0_4_ = auVar76._0_4_ * auVar72._0_4_;
      auVar235._4_4_ = auVar76._4_4_ * auVar72._4_4_;
      auVar235._8_4_ = auVar76._8_4_ * auVar72._8_4_;
      auVar235._12_4_ = auVar76._12_4_ * auVar72._12_4_;
      auVar82 = vinsertps_avx(auVar221,auVar193,0x4c);
      auVar222._0_4_ = auVar76._0_4_ * auVar82._0_4_;
      auVar222._4_4_ = auVar76._4_4_ * auVar82._4_4_;
      auVar222._8_4_ = auVar76._8_4_ * auVar82._8_4_;
      auVar222._12_4_ = auVar76._12_4_ * auVar82._12_4_;
      auVar76 = vminps_avx(auVar235,auVar222);
      auVar79 = vaddps_avx512vl(auVar79,auVar76);
      auVar76 = vmaxps_avx(auVar222,auVar235);
      auVar223._0_4_ = auVar75._0_4_ + auVar76._0_4_;
      auVar223._4_4_ = auVar75._4_4_ + auVar76._4_4_;
      auVar223._8_4_ = auVar75._8_4_ + auVar76._8_4_;
      auVar223._12_4_ = auVar75._12_4_ + auVar76._12_4_;
      auVar236._8_8_ = 0x3f80000000000000;
      auVar236._0_8_ = 0x3f80000000000000;
      auVar75 = vsubps_avx(auVar236,auVar223);
      auVar76 = vsubps_avx(auVar236,auVar79);
      auVar79 = vsubps_avx(auVar80,auVar78);
      auVar78 = vsubps_avx(auVar81,auVar78);
      fVar229 = auVar79._0_4_;
      auVar258._0_4_ = fVar229 * auVar75._0_4_;
      fVar240 = auVar79._4_4_;
      auVar258._4_4_ = fVar240 * auVar75._4_4_;
      fVar241 = auVar79._8_4_;
      auVar258._8_4_ = fVar241 * auVar75._8_4_;
      fVar242 = auVar79._12_4_;
      auVar258._12_4_ = fVar242 * auVar75._12_4_;
      auVar84 = vbroadcastss_avx512vl(auVar60);
      auVar71 = vmulps_avx512vl(auVar84,auVar71);
      auVar73 = vmulps_avx512vl(auVar84,auVar73);
      auVar84 = vminps_avx512vl(auVar71,auVar73);
      auVar73 = vmaxps_avx512vl(auVar73,auVar71);
      auVar71 = vbroadcastss_avx512vl(auVar83);
      auVar72 = vmulps_avx512vl(auVar71,auVar72);
      auVar71 = vmulps_avx512vl(auVar71,auVar82);
      auVar82 = vminps_avx512vl(auVar72,auVar71);
      auVar82 = vaddps_avx512vl(auVar84,auVar82);
      auVar79 = vmulps_avx512vl(auVar79,auVar76);
      fVar228 = auVar78._0_4_;
      auVar224._0_4_ = fVar228 * auVar75._0_4_;
      fVar217 = auVar78._4_4_;
      auVar224._4_4_ = fVar217 * auVar75._4_4_;
      fVar226 = auVar78._8_4_;
      auVar224._8_4_ = fVar226 * auVar75._8_4_;
      fVar227 = auVar78._12_4_;
      auVar224._12_4_ = fVar227 * auVar75._12_4_;
      auVar237._0_4_ = fVar228 * auVar76._0_4_;
      auVar237._4_4_ = fVar217 * auVar76._4_4_;
      auVar237._8_4_ = fVar226 * auVar76._8_4_;
      auVar237._12_4_ = fVar227 * auVar76._12_4_;
      auVar71 = vmaxps_avx(auVar71,auVar72);
      auVar194._0_4_ = auVar73._0_4_ + auVar71._0_4_;
      auVar194._4_4_ = auVar73._4_4_ + auVar71._4_4_;
      auVar194._8_4_ = auVar73._8_4_ + auVar71._8_4_;
      auVar194._12_4_ = auVar73._12_4_ + auVar71._12_4_;
      auVar207._8_8_ = 0x3f800000;
      auVar207._0_8_ = 0x3f800000;
      auVar71 = vsubps_avx(auVar207,auVar194);
      auVar72 = vsubps_avx512vl(auVar207,auVar82);
      auVar253._0_4_ = fVar229 * auVar71._0_4_;
      auVar253._4_4_ = fVar240 * auVar71._4_4_;
      auVar253._8_4_ = fVar241 * auVar71._8_4_;
      auVar253._12_4_ = fVar242 * auVar71._12_4_;
      auVar247._0_4_ = fVar229 * auVar72._0_4_;
      auVar247._4_4_ = fVar240 * auVar72._4_4_;
      auVar247._8_4_ = fVar241 * auVar72._8_4_;
      auVar247._12_4_ = fVar242 * auVar72._12_4_;
      auVar195._0_4_ = fVar228 * auVar71._0_4_;
      auVar195._4_4_ = fVar217 * auVar71._4_4_;
      auVar195._8_4_ = fVar226 * auVar71._8_4_;
      auVar195._12_4_ = fVar227 * auVar71._12_4_;
      auVar208._0_4_ = fVar228 * auVar72._0_4_;
      auVar208._4_4_ = fVar217 * auVar72._4_4_;
      auVar208._8_4_ = fVar226 * auVar72._8_4_;
      auVar208._12_4_ = fVar227 * auVar72._12_4_;
      auVar71 = vminps_avx(auVar253,auVar247);
      auVar72 = vminps_avx512vl(auVar195,auVar208);
      auVar82 = vminps_avx512vl(auVar71,auVar72);
      auVar71 = vmaxps_avx(auVar247,auVar253);
      auVar72 = vmaxps_avx(auVar208,auVar195);
      auVar72 = vmaxps_avx(auVar72,auVar71);
      auVar75 = vminps_avx512vl(auVar258,auVar79);
      auVar71 = vminps_avx(auVar224,auVar237);
      auVar71 = vminps_avx(auVar75,auVar71);
      auVar71 = vhaddps_avx(auVar82,auVar71);
      auVar118._0_16_ = vmaxps_avx512vl(auVar79,auVar258);
      auVar82 = vmaxps_avx(auVar237,auVar224);
      auVar82 = vmaxps_avx(auVar82,auVar118._0_16_);
      auVar72 = vhaddps_avx(auVar72,auVar82);
      auVar71 = vshufps_avx(auVar71,auVar71,0xe8);
      auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
      auVar196._0_4_ = auVar71._0_4_ + auVar159._0_4_;
      auVar196._4_4_ = auVar71._4_4_ + auVar159._4_4_;
      auVar196._8_4_ = auVar71._8_4_ + auVar159._8_4_;
      auVar196._12_4_ = auVar71._12_4_ + auVar159._12_4_;
      auVar209._0_4_ = auVar72._0_4_ + auVar159._0_4_;
      auVar209._4_4_ = auVar72._4_4_ + auVar159._4_4_;
      auVar209._8_4_ = auVar72._8_4_ + auVar159._8_4_;
      auVar209._12_4_ = auVar72._12_4_ + auVar159._12_4_;
      auVar71 = vmaxps_avx(auVar80,auVar196);
      auVar72 = vminps_avx(auVar209,auVar81);
      uVar1 = vcmpps_avx512vl(auVar72,auVar71,1);
    } while ((uVar1 & 3) != 0);
    uVar1 = vcmpps_avx512vl(auVar209,auVar81,1);
    uVar22 = vcmpps_avx512vl(auVar56,auVar196,1);
    if (((ushort)uVar22 & (ushort)uVar1 & 1) == 0) {
      bVar44 = 0;
    }
    else {
      auVar71 = vmovshdup_avx(auVar196);
      bVar44 = auVar74._0_4_ < auVar71._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar46 || uVar6 != 0 && !bVar54) | bVar44) == 1) {
      lVar48 = 0xc9;
      do {
        lVar48 = lVar48 + -1;
        if (lVar48 == 0) goto LAB_017e4128;
        auVar56 = vsubss_avx512f(auVar66,auVar159);
        fVar226 = auVar56._0_4_;
        fVar228 = fVar226 * fVar226 * fVar226;
        auVar56 = vmulss_avx512f(auVar159,ZEXT416(0x40400000));
        fVar217 = auVar56._0_4_ * fVar226 * fVar226;
        fVar227 = auVar159._0_4_;
        auVar56 = vmulss_avx512f(ZEXT416((uint)(fVar227 * fVar227)),ZEXT416(0x40400000));
        fVar226 = fVar226 * auVar56._0_4_;
        auVar154._4_4_ = fVar228;
        auVar154._0_4_ = fVar228;
        auVar154._8_4_ = fVar228;
        auVar154._12_4_ = fVar228;
        auVar149._4_4_ = fVar217;
        auVar149._0_4_ = fVar217;
        auVar149._8_4_ = fVar217;
        auVar149._12_4_ = fVar217;
        auVar123._4_4_ = fVar226;
        auVar123._0_4_ = fVar226;
        auVar123._8_4_ = fVar226;
        auVar123._12_4_ = fVar226;
        fVar227 = fVar227 * fVar227 * fVar227;
        auVar177._0_4_ = (float)local_480._0_4_ * fVar227;
        auVar177._4_4_ = (float)local_480._4_4_ * fVar227;
        auVar177._8_4_ = fStack_478 * fVar227;
        auVar177._12_4_ = fStack_474 * fVar227;
        auVar56 = vfmadd231ps_fma(auVar177,auVar64,auVar123);
        auVar56 = vfmadd231ps_fma(auVar56,auVar67,auVar149);
        auVar56 = vfmadd231ps_fma(auVar56,auVar58,auVar154);
        auVar124._8_8_ = auVar56._0_8_;
        auVar124._0_8_ = auVar56._0_8_;
        auVar56 = vshufpd_avx(auVar56,auVar56,3);
        auVar71 = vshufps_avx(auVar159,auVar159,0x55);
        auVar56 = vsubps_avx(auVar56,auVar124);
        auVar71 = vfmadd213ps_fma(auVar56,auVar71,auVar124);
        fVar228 = auVar71._0_4_;
        auVar56 = vshufps_avx(auVar71,auVar71,0x55);
        auVar125._0_4_ = auVar60._0_4_ * fVar228 + auVar83._0_4_ * auVar56._0_4_;
        auVar125._4_4_ = auVar60._4_4_ * fVar228 + auVar83._4_4_ * auVar56._4_4_;
        auVar125._8_4_ = auVar60._8_4_ * fVar228 + auVar83._8_4_ * auVar56._8_4_;
        auVar125._12_4_ = auVar60._12_4_ * fVar228 + auVar83._12_4_ * auVar56._12_4_;
        auVar159 = vsubps_avx(auVar159,auVar125);
        auVar56 = vandps_avx512vl(auVar71,auVar263._0_16_);
        auVar118._0_16_ = vprolq_avx512vl(auVar56,0x20);
        auVar56 = vmaxss_avx(auVar118._0_16_,auVar56);
        bVar54 = auVar56._0_4_ <= (float)local_490._0_4_;
      } while ((float)local_490._0_4_ <= auVar56._0_4_);
      auVar56 = vucomiss_avx512f(auVar77);
      if (bVar54) {
        auVar60 = vucomiss_avx512f(auVar56);
        auVar266 = ZEXT1664(auVar60);
        if (bVar54) {
          vmovshdup_avx(auVar56);
          auVar60 = vucomiss_avx512f(auVar77);
          if (bVar54) {
            auVar66 = vucomiss_avx512f(auVar60);
            auVar266 = ZEXT1664(auVar66);
            if (bVar54) {
              auVar71 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar77 = vinsertps_avx(auVar71,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar71 = vdpps_avx(auVar77,local_4a0,0x7f);
              auVar72 = vdpps_avx(auVar77,local_4b0,0x7f);
              auVar80 = vdpps_avx(auVar77,local_4c0,0x7f);
              auVar82 = vdpps_avx(auVar77,local_4d0,0x7f);
              auVar75 = vdpps_avx(auVar77,local_4e0,0x7f);
              auVar76 = vdpps_avx(auVar77,local_4f0,0x7f);
              auVar79 = vdpps_avx(auVar77,local_500,0x7f);
              auVar77 = vdpps_avx(auVar77,local_510,0x7f);
              auVar78 = vsubss_avx512f(auVar66,auVar60);
              fVar229 = auVar60._0_4_;
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar75._0_4_)),auVar78,auVar71);
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar229)),auVar78,auVar72);
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar229)),auVar78,auVar80);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar77._0_4_)),auVar78,auVar82);
              auVar66 = vsubss_avx512f(auVar66,auVar56);
              auVar187._0_4_ = auVar66._0_4_;
              fVar217 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
              auVar66 = vmulss_avx512f(auVar56,ZEXT416(0x40400000));
              fVar226 = auVar66._0_4_ * auVar187._0_4_ * auVar187._0_4_;
              fVar228 = auVar56._0_4_;
              auVar178._0_4_ = fVar228 * fVar228;
              auVar178._4_4_ = auVar56._4_4_ * auVar56._4_4_;
              auVar178._8_4_ = auVar56._8_4_ * auVar56._8_4_;
              auVar178._12_4_ = auVar56._12_4_ * auVar56._12_4_;
              auVar118._0_16_ = vmulss_avx512f(auVar178,ZEXT416(0x40400000));
              fVar227 = auVar187._0_4_ * auVar118._0_4_;
              fVar241 = fVar228 * auVar178._0_4_;
              auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * auVar80._0_4_)),
                                        ZEXT416((uint)fVar227),auVar72);
              auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar226),auVar71);
              auVar60 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar217),auVar60);
              fVar240 = auVar60._0_4_;
              if ((fVar120 <= fVar240) &&
                 (fVar242 = *(float *)(ray + k * 4 + 0x200), fVar240 <= fVar242)) {
                auVar60 = vshufps_avx(auVar56,auVar56,0x55);
                auVar71 = vsubps_avx512vl(auVar59,auVar60);
                fVar243 = auVar60._0_4_;
                auVar215._0_4_ = fVar243 * (float)local_530._0_4_;
                fVar248 = auVar60._4_4_;
                auVar215._4_4_ = fVar248 * (float)local_530._4_4_;
                fVar249 = auVar60._8_4_;
                auVar215._8_4_ = fVar249 * fStack_528;
                fVar250 = auVar60._12_4_;
                auVar215._12_4_ = fVar250 * fStack_524;
                auVar225._0_4_ = fVar243 * (float)local_580._0_4_;
                auVar225._4_4_ = fVar248 * (float)local_580._4_4_;
                auVar225._8_4_ = fVar249 * fStack_578;
                auVar225._12_4_ = fVar250 * fStack_574;
                auVar238._0_4_ = fVar243 * (float)local_590._0_4_;
                auVar238._4_4_ = fVar248 * (float)local_590._4_4_;
                auVar238._8_4_ = fVar249 * fStack_588;
                auVar238._12_4_ = fVar250 * fStack_584;
                auVar197._0_4_ = fVar243 * (float)local_550._0_4_;
                auVar197._4_4_ = fVar248 * (float)local_550._4_4_;
                auVar197._8_4_ = fVar249 * fStack_548;
                auVar197._12_4_ = fVar250 * fStack_544;
                auVar60 = vfmadd231ps_fma(auVar215,auVar71,local_520);
                auVar59 = vfmadd231ps_fma(auVar225,auVar71,local_560);
                auVar66 = vfmadd231ps_fma(auVar238,auVar71,local_570);
                auVar71 = vfmadd231ps_fma(auVar197,auVar71,local_540);
                auVar60 = vsubps_avx(auVar59,auVar60);
                auVar59 = vsubps_avx(auVar66,auVar59);
                auVar66 = vsubps_avx(auVar71,auVar66);
                auVar239._0_4_ = fVar228 * auVar59._0_4_;
                auVar239._4_4_ = fVar228 * auVar59._4_4_;
                auVar239._8_4_ = fVar228 * auVar59._8_4_;
                auVar239._12_4_ = fVar228 * auVar59._12_4_;
                auVar187._4_4_ = auVar187._0_4_;
                auVar187._8_4_ = auVar187._0_4_;
                auVar187._12_4_ = auVar187._0_4_;
                auVar60 = vfmadd231ps_fma(auVar239,auVar187,auVar60);
                auVar198._0_4_ = fVar228 * auVar66._0_4_;
                auVar198._4_4_ = fVar228 * auVar66._4_4_;
                auVar198._8_4_ = fVar228 * auVar66._8_4_;
                auVar198._12_4_ = fVar228 * auVar66._12_4_;
                auVar59 = vfmadd231ps_fma(auVar198,auVar187,auVar59);
                auVar199._0_4_ = fVar228 * auVar59._0_4_;
                auVar199._4_4_ = fVar228 * auVar59._4_4_;
                auVar199._8_4_ = fVar228 * auVar59._8_4_;
                auVar199._12_4_ = fVar228 * auVar59._12_4_;
                auVar60 = vfmadd231ps_fma(auVar199,auVar187,auVar60);
                auVar118._0_16_ = vmulps_avx512vl(auVar60,auVar121);
                pGVar7 = (context->scene->geometries).items[uVar4].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar179._0_4_ = fVar241 * (float)local_5d0._0_4_;
                  auVar179._4_4_ = fVar241 * (float)local_5d0._4_4_;
                  auVar179._8_4_ = fVar241 * fStack_5c8;
                  auVar179._12_4_ = fVar241 * fStack_5c4;
                  auVar166._4_4_ = fVar227;
                  auVar166._0_4_ = fVar227;
                  auVar166._8_4_ = fVar227;
                  auVar166._12_4_ = fVar227;
                  auVar60 = vfmadd132ps_fma(auVar166,auVar179,local_5c0);
                  auVar155._4_4_ = fVar226;
                  auVar155._0_4_ = fVar226;
                  auVar155._8_4_ = fVar226;
                  auVar155._12_4_ = fVar226;
                  auVar60 = vfmadd132ps_fma(auVar155,auVar60,local_5b0);
                  auVar150._4_4_ = fVar217;
                  auVar150._0_4_ = fVar217;
                  auVar150._8_4_ = fVar217;
                  auVar150._12_4_ = fVar217;
                  auVar66 = vfmadd132ps_fma(auVar150,auVar60,local_5a0);
                  auVar60 = vshufps_avx(auVar66,auVar66,0xc9);
                  auVar59 = vshufps_avx(auVar118._0_16_,auVar118._0_16_,0xc9);
                  auVar151._0_4_ = auVar66._0_4_ * auVar59._0_4_;
                  auVar151._4_4_ = auVar66._4_4_ * auVar59._4_4_;
                  auVar151._8_4_ = auVar66._8_4_ * auVar59._8_4_;
                  auVar151._12_4_ = auVar66._12_4_ * auVar59._12_4_;
                  auVar60 = vfmsub231ps_fma(auVar151,auVar118._0_16_,auVar60);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar240;
                    uVar128 = vextractps_avx(auVar60,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar128;
                    uVar128 = vextractps_avx(auVar60,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar128;
                    *(int *)(ray + k * 4 + 0x380) = auVar60._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar228;
                    *(float *)(ray + k * 4 + 0x400) = fVar229;
                    *(uint *)(ray + k * 4 + 0x440) = uVar5;
                    *(uint *)(ray + k * 4 + 0x480) = uVar4;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    goto LAB_017e4128;
                  }
                  local_200 = vbroadcastss_avx512f(auVar56);
                  auVar117 = vbroadcastss_avx512f(ZEXT416(1));
                  local_1c0 = vpermps_avx512f(auVar117,ZEXT1664(auVar56));
                  auVar117 = vpermps_avx512f(auVar117,ZEXT1664(auVar60));
                  auVar118 = vbroadcastss_avx512f(ZEXT416(2));
                  local_280 = vpermps_avx512f(auVar118,ZEXT1664(auVar60));
                  local_240 = vbroadcastss_avx512f(auVar60);
                  local_2c0[0] = (RTCHitN)auVar117[0];
                  local_2c0[1] = (RTCHitN)auVar117[1];
                  local_2c0[2] = (RTCHitN)auVar117[2];
                  local_2c0[3] = (RTCHitN)auVar117[3];
                  local_2c0[4] = (RTCHitN)auVar117[4];
                  local_2c0[5] = (RTCHitN)auVar117[5];
                  local_2c0[6] = (RTCHitN)auVar117[6];
                  local_2c0[7] = (RTCHitN)auVar117[7];
                  local_2c0[8] = (RTCHitN)auVar117[8];
                  local_2c0[9] = (RTCHitN)auVar117[9];
                  local_2c0[10] = (RTCHitN)auVar117[10];
                  local_2c0[0xb] = (RTCHitN)auVar117[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar117[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar117[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar117[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar117[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar117[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar117[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar117[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar117[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar117[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar117[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar117[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar117[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar117[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar117[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar117[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar117[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar117[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar117[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar117[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar117[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar117[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar117[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar117[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar117[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar117[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar117[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar117[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar117[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar117[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar117[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar117[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar117[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar117[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar117[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar117[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar117[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar117[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar117[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar117[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar117[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar117[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar117[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar117[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar117[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar117[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar117[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar117[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar117[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar117[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar117[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar117[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar117[0x3f];
                  local_180 = local_340._0_8_;
                  uStack_178 = local_340._8_8_;
                  uStack_170 = local_340._16_8_;
                  uStack_168 = local_340._24_8_;
                  uStack_160 = local_340._32_8_;
                  uStack_158 = local_340._40_8_;
                  uStack_150 = local_340._48_8_;
                  uStack_148 = local_340._56_8_;
                  auVar117 = vmovdqa64_avx512f(local_300);
                  local_140 = vmovdqa64_avx512f(auVar117);
                  vpcmpeqd_avx2(auVar117._0_32_,auVar117._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar240;
                  auVar118 = vmovdqa64_avx512f(local_380);
                  local_400 = vmovdqa64_avx512f(auVar118);
                  local_620.valid = (int *)local_400;
                  local_620.geometryUserPtr = pGVar7->userPtr;
                  local_620.context = context->user;
                  local_620.hit = local_2c0;
                  local_620.N = 0x10;
                  local_620.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_620);
                    auVar266 = ZEXT464(0x3f800000);
                    auVar262 = ZEXT3264(_DAT_01fb9fe0);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar261 = ZEXT1664(auVar56);
                    auVar117._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar260 = ZEXT3264(auVar117._32_32_);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar259 = ZEXT1664(auVar56);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar126 = ZEXT1664(auVar56);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar264 = ZEXT1664(auVar56);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar263 = ZEXT1664(auVar56);
                    auVar118 = vmovdqa64_avx512f(local_400);
                  }
                  uVar22 = vptestmd_avx512f(auVar118,auVar118);
                  if ((short)uVar22 != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_620);
                      auVar266 = ZEXT464(0x3f800000);
                      auVar262 = ZEXT3264(_DAT_01fb9fe0);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar261 = ZEXT1664(auVar56);
                      auVar117._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar260 = ZEXT3264(auVar117._32_32_);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar259 = ZEXT1664(auVar56);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar126 = ZEXT1664(auVar56);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar264 = ZEXT1664(auVar56);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar263 = ZEXT1664(auVar56);
                      auVar118 = vmovdqa64_avx512f(local_400);
                    }
                    uVar1 = vptestmd_avx512f(auVar118,auVar118);
                    if ((short)uVar1 != 0) {
                      iVar29 = *(int *)(local_620.hit + 4);
                      iVar30 = *(int *)(local_620.hit + 8);
                      iVar31 = *(int *)(local_620.hit + 0xc);
                      iVar32 = *(int *)(local_620.hit + 0x10);
                      iVar33 = *(int *)(local_620.hit + 0x14);
                      iVar34 = *(int *)(local_620.hit + 0x18);
                      iVar35 = *(int *)(local_620.hit + 0x1c);
                      iVar36 = *(int *)(local_620.hit + 0x20);
                      iVar37 = *(int *)(local_620.hit + 0x24);
                      iVar38 = *(int *)(local_620.hit + 0x28);
                      iVar39 = *(int *)(local_620.hit + 0x2c);
                      iVar40 = *(int *)(local_620.hit + 0x30);
                      iVar41 = *(int *)(local_620.hit + 0x34);
                      iVar42 = *(int *)(local_620.hit + 0x38);
                      iVar43 = *(int *)(local_620.hit + 0x3c);
                      bVar44 = (byte)uVar1;
                      bVar54 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar55 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar52 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar53 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar1 >> 7) & 1);
                      bVar14 = (byte)(uVar1 >> 8);
                      bVar15 = (bool)((byte)(uVar1 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar1 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar1 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar1 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar1 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar1 >> 0xe) & 1);
                      bVar21 = SUB81(uVar1 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x300) =
                           (uint)(bVar44 & 1) * *(int *)local_620.hit |
                           (uint)!(bool)(bVar44 & 1) * *(int *)(local_620.ray + 0x300);
                      *(uint *)(local_620.ray + 0x304) =
                           (uint)bVar54 * iVar29 | (uint)!bVar54 * *(int *)(local_620.ray + 0x304);
                      *(uint *)(local_620.ray + 0x308) =
                           (uint)bVar55 * iVar30 | (uint)!bVar55 * *(int *)(local_620.ray + 0x308);
                      *(uint *)(local_620.ray + 0x30c) =
                           (uint)bVar52 * iVar31 | (uint)!bVar52 * *(int *)(local_620.ray + 0x30c);
                      *(uint *)(local_620.ray + 0x310) =
                           (uint)bVar53 * iVar32 | (uint)!bVar53 * *(int *)(local_620.ray + 0x310);
                      *(uint *)(local_620.ray + 0x314) =
                           (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_620.ray + 0x314);
                      *(uint *)(local_620.ray + 0x318) =
                           (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_620.ray + 0x318);
                      *(uint *)(local_620.ray + 0x31c) =
                           (uint)bVar13 * iVar35 | (uint)!bVar13 * *(int *)(local_620.ray + 0x31c);
                      *(uint *)(local_620.ray + 800) =
                           (uint)(bVar14 & 1) * iVar36 |
                           (uint)!(bool)(bVar14 & 1) * *(int *)(local_620.ray + 800);
                      *(uint *)(local_620.ray + 0x324) =
                           (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_620.ray + 0x324);
                      *(uint *)(local_620.ray + 0x328) =
                           (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_620.ray + 0x328);
                      *(uint *)(local_620.ray + 0x32c) =
                           (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_620.ray + 0x32c);
                      *(uint *)(local_620.ray + 0x330) =
                           (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_620.ray + 0x330);
                      *(uint *)(local_620.ray + 0x334) =
                           (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_620.ray + 0x334);
                      *(uint *)(local_620.ray + 0x338) =
                           (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_620.ray + 0x338);
                      *(uint *)(local_620.ray + 0x33c) =
                           (uint)bVar21 * iVar43 | (uint)!bVar21 * *(int *)(local_620.ray + 0x33c);
                      iVar29 = *(int *)(local_620.hit + 0x44);
                      iVar30 = *(int *)(local_620.hit + 0x48);
                      iVar31 = *(int *)(local_620.hit + 0x4c);
                      iVar32 = *(int *)(local_620.hit + 0x50);
                      iVar33 = *(int *)(local_620.hit + 0x54);
                      iVar34 = *(int *)(local_620.hit + 0x58);
                      iVar35 = *(int *)(local_620.hit + 0x5c);
                      iVar36 = *(int *)(local_620.hit + 0x60);
                      iVar37 = *(int *)(local_620.hit + 100);
                      iVar38 = *(int *)(local_620.hit + 0x68);
                      iVar39 = *(int *)(local_620.hit + 0x6c);
                      iVar40 = *(int *)(local_620.hit + 0x70);
                      iVar41 = *(int *)(local_620.hit + 0x74);
                      iVar42 = *(int *)(local_620.hit + 0x78);
                      iVar43 = *(int *)(local_620.hit + 0x7c);
                      bVar54 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar55 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar52 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar53 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar1 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar1 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar1 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar1 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar1 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar1 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar1 >> 0xe) & 1);
                      bVar21 = SUB81(uVar1 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x340) =
                           (uint)(bVar44 & 1) * *(int *)(local_620.hit + 0x40) |
                           (uint)!(bool)(bVar44 & 1) * *(int *)(local_620.ray + 0x340);
                      *(uint *)(local_620.ray + 0x344) =
                           (uint)bVar54 * iVar29 | (uint)!bVar54 * *(int *)(local_620.ray + 0x344);
                      *(uint *)(local_620.ray + 0x348) =
                           (uint)bVar55 * iVar30 | (uint)!bVar55 * *(int *)(local_620.ray + 0x348);
                      *(uint *)(local_620.ray + 0x34c) =
                           (uint)bVar52 * iVar31 | (uint)!bVar52 * *(int *)(local_620.ray + 0x34c);
                      *(uint *)(local_620.ray + 0x350) =
                           (uint)bVar53 * iVar32 | (uint)!bVar53 * *(int *)(local_620.ray + 0x350);
                      *(uint *)(local_620.ray + 0x354) =
                           (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_620.ray + 0x354);
                      *(uint *)(local_620.ray + 0x358) =
                           (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_620.ray + 0x358);
                      *(uint *)(local_620.ray + 0x35c) =
                           (uint)bVar13 * iVar35 | (uint)!bVar13 * *(int *)(local_620.ray + 0x35c);
                      *(uint *)(local_620.ray + 0x360) =
                           (uint)(bVar14 & 1) * iVar36 |
                           (uint)!(bool)(bVar14 & 1) * *(int *)(local_620.ray + 0x360);
                      *(uint *)(local_620.ray + 0x364) =
                           (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_620.ray + 0x364);
                      *(uint *)(local_620.ray + 0x368) =
                           (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_620.ray + 0x368);
                      *(uint *)(local_620.ray + 0x36c) =
                           (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_620.ray + 0x36c);
                      *(uint *)(local_620.ray + 0x370) =
                           (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_620.ray + 0x370);
                      *(uint *)(local_620.ray + 0x374) =
                           (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_620.ray + 0x374);
                      *(uint *)(local_620.ray + 0x378) =
                           (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_620.ray + 0x378);
                      *(uint *)(local_620.ray + 0x37c) =
                           (uint)bVar21 * iVar43 | (uint)!bVar21 * *(int *)(local_620.ray + 0x37c);
                      iVar29 = *(int *)(local_620.hit + 0x84);
                      iVar30 = *(int *)(local_620.hit + 0x88);
                      iVar31 = *(int *)(local_620.hit + 0x8c);
                      iVar32 = *(int *)(local_620.hit + 0x90);
                      iVar33 = *(int *)(local_620.hit + 0x94);
                      iVar34 = *(int *)(local_620.hit + 0x98);
                      iVar35 = *(int *)(local_620.hit + 0x9c);
                      iVar36 = *(int *)(local_620.hit + 0xa0);
                      iVar37 = *(int *)(local_620.hit + 0xa4);
                      iVar38 = *(int *)(local_620.hit + 0xa8);
                      iVar39 = *(int *)(local_620.hit + 0xac);
                      iVar40 = *(int *)(local_620.hit + 0xb0);
                      iVar41 = *(int *)(local_620.hit + 0xb4);
                      iVar42 = *(int *)(local_620.hit + 0xb8);
                      iVar43 = *(int *)(local_620.hit + 0xbc);
                      bVar54 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar55 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar52 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar53 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar1 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar1 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar1 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar1 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar1 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar1 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar1 >> 0xe) & 1);
                      bVar21 = SUB81(uVar1 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x380) =
                           (uint)(bVar44 & 1) * *(int *)(local_620.hit + 0x80) |
                           (uint)!(bool)(bVar44 & 1) * *(int *)(local_620.ray + 0x380);
                      *(uint *)(local_620.ray + 900) =
                           (uint)bVar54 * iVar29 | (uint)!bVar54 * *(int *)(local_620.ray + 900);
                      *(uint *)(local_620.ray + 0x388) =
                           (uint)bVar55 * iVar30 | (uint)!bVar55 * *(int *)(local_620.ray + 0x388);
                      *(uint *)(local_620.ray + 0x38c) =
                           (uint)bVar52 * iVar31 | (uint)!bVar52 * *(int *)(local_620.ray + 0x38c);
                      *(uint *)(local_620.ray + 0x390) =
                           (uint)bVar53 * iVar32 | (uint)!bVar53 * *(int *)(local_620.ray + 0x390);
                      *(uint *)(local_620.ray + 0x394) =
                           (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_620.ray + 0x394);
                      *(uint *)(local_620.ray + 0x398) =
                           (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_620.ray + 0x398);
                      *(uint *)(local_620.ray + 0x39c) =
                           (uint)bVar13 * iVar35 | (uint)!bVar13 * *(int *)(local_620.ray + 0x39c);
                      *(uint *)(local_620.ray + 0x3a0) =
                           (uint)(bVar14 & 1) * iVar36 |
                           (uint)!(bool)(bVar14 & 1) * *(int *)(local_620.ray + 0x3a0);
                      *(uint *)(local_620.ray + 0x3a4) =
                           (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_620.ray + 0x3a4);
                      *(uint *)(local_620.ray + 0x3a8) =
                           (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_620.ray + 0x3a8);
                      *(uint *)(local_620.ray + 0x3ac) =
                           (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3ac);
                      *(uint *)(local_620.ray + 0x3b0) =
                           (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3b0);
                      *(uint *)(local_620.ray + 0x3b4) =
                           (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3b4);
                      *(uint *)(local_620.ray + 0x3b8) =
                           (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3b8);
                      *(uint *)(local_620.ray + 0x3bc) =
                           (uint)bVar21 * iVar43 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3bc);
                      iVar29 = *(int *)(local_620.hit + 0xc4);
                      iVar30 = *(int *)(local_620.hit + 200);
                      iVar31 = *(int *)(local_620.hit + 0xcc);
                      iVar32 = *(int *)(local_620.hit + 0xd0);
                      iVar33 = *(int *)(local_620.hit + 0xd4);
                      iVar34 = *(int *)(local_620.hit + 0xd8);
                      iVar35 = *(int *)(local_620.hit + 0xdc);
                      iVar36 = *(int *)(local_620.hit + 0xe0);
                      iVar37 = *(int *)(local_620.hit + 0xe4);
                      iVar38 = *(int *)(local_620.hit + 0xe8);
                      iVar39 = *(int *)(local_620.hit + 0xec);
                      iVar40 = *(int *)(local_620.hit + 0xf0);
                      iVar41 = *(int *)(local_620.hit + 0xf4);
                      iVar42 = *(int *)(local_620.hit + 0xf8);
                      iVar43 = *(int *)(local_620.hit + 0xfc);
                      bVar54 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar55 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar52 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar53 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar1 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar1 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar1 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar1 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar1 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar1 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar1 >> 0xe) & 1);
                      bVar21 = SUB81(uVar1 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x3c0) =
                           (uint)(bVar44 & 1) * *(int *)(local_620.hit + 0xc0) |
                           (uint)!(bool)(bVar44 & 1) * *(int *)(local_620.ray + 0x3c0);
                      *(uint *)(local_620.ray + 0x3c4) =
                           (uint)bVar54 * iVar29 | (uint)!bVar54 * *(int *)(local_620.ray + 0x3c4);
                      *(uint *)(local_620.ray + 0x3c8) =
                           (uint)bVar55 * iVar30 | (uint)!bVar55 * *(int *)(local_620.ray + 0x3c8);
                      *(uint *)(local_620.ray + 0x3cc) =
                           (uint)bVar52 * iVar31 | (uint)!bVar52 * *(int *)(local_620.ray + 0x3cc);
                      *(uint *)(local_620.ray + 0x3d0) =
                           (uint)bVar53 * iVar32 | (uint)!bVar53 * *(int *)(local_620.ray + 0x3d0);
                      *(uint *)(local_620.ray + 0x3d4) =
                           (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_620.ray + 0x3d4);
                      *(uint *)(local_620.ray + 0x3d8) =
                           (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_620.ray + 0x3d8);
                      *(uint *)(local_620.ray + 0x3dc) =
                           (uint)bVar13 * iVar35 | (uint)!bVar13 * *(int *)(local_620.ray + 0x3dc);
                      *(uint *)(local_620.ray + 0x3e0) =
                           (uint)(bVar14 & 1) * iVar36 |
                           (uint)!(bool)(bVar14 & 1) * *(int *)(local_620.ray + 0x3e0);
                      *(uint *)(local_620.ray + 0x3e4) =
                           (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_620.ray + 0x3e4);
                      *(uint *)(local_620.ray + 1000) =
                           (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_620.ray + 1000);
                      *(uint *)(local_620.ray + 0x3ec) =
                           (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3ec);
                      *(uint *)(local_620.ray + 0x3f0) =
                           (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3f0);
                      *(uint *)(local_620.ray + 0x3f4) =
                           (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3f4);
                      *(uint *)(local_620.ray + 0x3f8) =
                           (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3f8);
                      *(uint *)(local_620.ray + 0x3fc) =
                           (uint)bVar21 * iVar43 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3fc);
                      iVar29 = *(int *)(local_620.hit + 0x104);
                      iVar30 = *(int *)(local_620.hit + 0x108);
                      iVar31 = *(int *)(local_620.hit + 0x10c);
                      iVar32 = *(int *)(local_620.hit + 0x110);
                      iVar33 = *(int *)(local_620.hit + 0x114);
                      iVar34 = *(int *)(local_620.hit + 0x118);
                      iVar35 = *(int *)(local_620.hit + 0x11c);
                      iVar36 = *(int *)(local_620.hit + 0x120);
                      iVar37 = *(int *)(local_620.hit + 0x124);
                      iVar38 = *(int *)(local_620.hit + 0x128);
                      iVar39 = *(int *)(local_620.hit + 300);
                      iVar40 = *(int *)(local_620.hit + 0x130);
                      iVar41 = *(int *)(local_620.hit + 0x134);
                      iVar42 = *(int *)(local_620.hit + 0x138);
                      iVar43 = *(int *)(local_620.hit + 0x13c);
                      bVar54 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar55 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar52 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar53 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar1 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar1 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar1 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar1 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar1 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar1 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar1 >> 0xe) & 1);
                      bVar21 = SUB81(uVar1 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x400) =
                           (uint)(bVar44 & 1) * *(int *)(local_620.hit + 0x100) |
                           (uint)!(bool)(bVar44 & 1) * *(int *)(local_620.ray + 0x400);
                      *(uint *)(local_620.ray + 0x404) =
                           (uint)bVar54 * iVar29 | (uint)!bVar54 * *(int *)(local_620.ray + 0x404);
                      *(uint *)(local_620.ray + 0x408) =
                           (uint)bVar55 * iVar30 | (uint)!bVar55 * *(int *)(local_620.ray + 0x408);
                      *(uint *)(local_620.ray + 0x40c) =
                           (uint)bVar52 * iVar31 | (uint)!bVar52 * *(int *)(local_620.ray + 0x40c);
                      *(uint *)(local_620.ray + 0x410) =
                           (uint)bVar53 * iVar32 | (uint)!bVar53 * *(int *)(local_620.ray + 0x410);
                      *(uint *)(local_620.ray + 0x414) =
                           (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_620.ray + 0x414);
                      *(uint *)(local_620.ray + 0x418) =
                           (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_620.ray + 0x418);
                      *(uint *)(local_620.ray + 0x41c) =
                           (uint)bVar13 * iVar35 | (uint)!bVar13 * *(int *)(local_620.ray + 0x41c);
                      *(uint *)(local_620.ray + 0x420) =
                           (uint)(bVar14 & 1) * iVar36 |
                           (uint)!(bool)(bVar14 & 1) * *(int *)(local_620.ray + 0x420);
                      *(uint *)(local_620.ray + 0x424) =
                           (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_620.ray + 0x424);
                      *(uint *)(local_620.ray + 0x428) =
                           (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_620.ray + 0x428);
                      *(uint *)(local_620.ray + 0x42c) =
                           (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_620.ray + 0x42c);
                      *(uint *)(local_620.ray + 0x430) =
                           (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_620.ray + 0x430);
                      *(uint *)(local_620.ray + 0x434) =
                           (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_620.ray + 0x434);
                      *(uint *)(local_620.ray + 0x438) =
                           (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_620.ray + 0x438);
                      *(uint *)(local_620.ray + 0x43c) =
                           (uint)bVar21 * iVar43 | (uint)!bVar21 * *(int *)(local_620.ray + 0x43c);
                      auVar117 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x140));
                      auVar117 = vmovdqu32_avx512f(auVar117);
                      *(undefined1 (*) [64])(local_620.ray + 0x440) = auVar117;
                      auVar117 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x180));
                      auVar117 = vmovdqu32_avx512f(auVar117);
                      *(undefined1 (*) [64])(local_620.ray + 0x480) = auVar117;
                      auVar119 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x1c0));
                      auVar117 = vmovdqa32_avx512f(auVar119);
                      *(undefined1 (*) [64])(local_620.ray + 0x4c0) = auVar117;
                      auVar117 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x200));
                      bVar54 = (bool)((byte)(uVar1 >> 1) & 1);
                      auVar28._4_56_ = auVar117._8_56_;
                      auVar28._0_4_ = (uint)bVar54 * auVar117._4_4_ | (uint)!bVar54 * auVar119._4_4_
                      ;
                      auVar118._0_8_ = auVar28._0_8_ << 0x20;
                      bVar54 = (bool)((byte)(uVar1 >> 2) & 1);
                      auVar118._8_4_ =
                           (uint)bVar54 * auVar117._8_4_ | (uint)!bVar54 * auVar119._8_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 3) & 1);
                      auVar118._12_4_ =
                           (uint)bVar54 * auVar117._12_4_ | (uint)!bVar54 * auVar119._12_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 4) & 1);
                      auVar118._16_4_ =
                           (uint)bVar54 * auVar117._16_4_ | (uint)!bVar54 * auVar119._16_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 5) & 1);
                      auVar118._20_4_ =
                           (uint)bVar54 * auVar117._20_4_ | (uint)!bVar54 * auVar119._20_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 6) & 1);
                      auVar118._24_4_ =
                           (uint)bVar54 * auVar117._24_4_ | (uint)!bVar54 * auVar119._24_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 7) & 1);
                      auVar118._28_4_ =
                           (uint)bVar54 * auVar117._28_4_ | (uint)!bVar54 * auVar119._28_4_;
                      auVar118._32_4_ =
                           (uint)(bVar14 & 1) * auVar117._32_4_ |
                           (uint)!(bool)(bVar14 & 1) * auVar119._32_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 9) & 1);
                      auVar118._36_4_ =
                           (uint)bVar54 * auVar117._36_4_ | (uint)!bVar54 * auVar119._36_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 10) & 1);
                      auVar118._40_4_ =
                           (uint)bVar54 * auVar117._40_4_ | (uint)!bVar54 * auVar119._40_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 0xb) & 1);
                      auVar118._44_4_ =
                           (uint)bVar54 * auVar117._44_4_ | (uint)!bVar54 * auVar119._44_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 0xc) & 1);
                      auVar118._48_4_ =
                           (uint)bVar54 * auVar117._48_4_ | (uint)!bVar54 * auVar119._48_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 0xd) & 1);
                      auVar118._52_4_ =
                           (uint)bVar54 * auVar117._52_4_ | (uint)!bVar54 * auVar119._52_4_;
                      bVar54 = (bool)((byte)(uVar1 >> 0xe) & 1);
                      auVar118._56_4_ =
                           (uint)bVar54 * auVar117._56_4_ | (uint)!bVar54 * auVar119._56_4_;
                      bVar54 = SUB81(uVar1 >> 0xf,0);
                      auVar118._60_4_ =
                           (uint)bVar54 * auVar117._60_4_ | (uint)!bVar54 * auVar119._60_4_;
                      auVar117 = vmovdqa32_avx512f(auVar117);
                      *(undefined1 (*) [64])(local_620.ray + 0x500) = auVar117;
                      goto LAB_017e4128;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar242;
                }
              }
            }
          }
        }
      }
      goto LAB_017e4128;
    }
    auVar84 = vinsertps_avx(auVar74,auVar180,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }